

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar62;
  byte bVar63;
  ulong uVar64;
  ulong uVar65;
  uint uVar66;
  uint uVar67;
  long lVar68;
  ulong uVar69;
  uint uVar70;
  bool bVar71;
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar73 [16];
  float fVar98;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar103 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float t1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar167;
  undefined1 auVar166 [32];
  float fVar168;
  float fVar187;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar185;
  float fVar186;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar191;
  float fVar211;
  float fVar212;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar207 [32];
  float fVar213;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar217;
  undefined1 auVar210 [32];
  float fVar218;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar231;
  float fVar232;
  float fVar234;
  float fVar236;
  float fVar237;
  undefined1 auVar227 [32];
  float fVar233;
  undefined1 auVar228 [32];
  undefined1 auVar235 [16];
  undefined1 auVar230 [64];
  vfloat4 b0;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar252;
  float fVar253;
  float fVar262;
  float fVar264;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar263;
  float fVar265;
  float fVar266;
  undefined1 auVar261 [32];
  float fVar267;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar282;
  float fVar283;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar284;
  undefined1 auVar281 [32];
  __m128 a;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  vfloat4 a0_1;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar306;
  float fVar311;
  float fVar312;
  vfloat4 a0;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar313;
  undefined1 auVar309 [16];
  float fVar314;
  float fVar315;
  float fVar316;
  float in_register_0000151c;
  undefined1 auVar310 [32];
  float fVar317;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [32];
  float fVar323;
  undefined1 auVar322 [64];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float in_register_0000159c;
  undefined1 auVar327 [32];
  float fVar330;
  undefined1 auVar329 [16];
  float in_register_000015dc;
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_690 [8];
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  uint auStack_4b0 [4];
  RTCFilterFunctionNArguments local_4a0;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  float afStack_340 [8];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar229 [32];
  undefined1 auVar328 [32];
  
  PVar7 = prim[1];
  uVar65 = (ulong)(byte)PVar7;
  lVar68 = uVar65 * 5;
  auVar147 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar197 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar197 = vinsertps_avx(auVar197,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar191 = *(float *)(prim + uVar65 * 0x19 + 0x12);
  auVar147 = vsubps_avx(auVar147,*(undefined1 (*) [16])(prim + uVar65 * 0x19 + 6));
  auVar99._0_4_ = fVar191 * auVar147._0_4_;
  auVar99._4_4_ = fVar191 * auVar147._4_4_;
  auVar99._8_4_ = fVar191 * auVar147._8_4_;
  auVar99._12_4_ = fVar191 * auVar147._12_4_;
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  auVar145 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 10)));
  auVar192._0_4_ = fVar191 * auVar197._0_4_;
  auVar192._4_4_ = fVar191 * auVar197._4_4_;
  auVar192._8_4_ = fVar191 * auVar197._8_4_;
  auVar192._12_4_ = fVar191 * auVar197._12_4_;
  auVar87._16_16_ = auVar145;
  auVar87._0_16_ = auVar147;
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar68 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar68 + 10)));
  auVar148._16_16_ = auVar197;
  auVar148._0_16_ = auVar147;
  auVar14 = vcvtdq2ps_avx(auVar148);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 10)));
  auVar162._16_16_ = auVar197;
  auVar162._0_16_ = auVar147;
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xb + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xb + 10)));
  auVar15 = vcvtdq2ps_avx(auVar162);
  auVar163._16_16_ = auVar197;
  auVar163._0_16_ = auVar147;
  auVar16 = vcvtdq2ps_avx(auVar163);
  uVar69 = (ulong)((uint)(byte)PVar7 * 0xc);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 10)));
  auVar227._16_16_ = auVar197;
  auVar227._0_16_ = auVar147;
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + uVar65 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar227);
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + uVar65 + 10)));
  auVar245._16_16_ = auVar197;
  auVar245._0_16_ = auVar147;
  lVar12 = uVar65 * 9;
  uVar69 = (ulong)(uint)((int)lVar12 * 2);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar245);
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 10)));
  auVar246._16_16_ = auVar197;
  auVar246._0_16_ = auVar147;
  auVar19 = vcvtdq2ps_avx(auVar246);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + uVar65 + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + uVar65 + 10)));
  auVar279._16_16_ = auVar197;
  auVar279._0_16_ = auVar147;
  uVar69 = (ulong)(uint)((int)lVar68 << 2);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 10)));
  auVar20 = vcvtdq2ps_avx(auVar279);
  auVar293._16_16_ = auVar197;
  auVar293._0_16_ = auVar147;
  auVar21 = vcvtdq2ps_avx(auVar293);
  auVar147 = vshufps_avx(auVar192,auVar192,0);
  auVar197 = vshufps_avx(auVar192,auVar192,0x55);
  auVar145 = vshufps_avx(auVar192,auVar192,0xaa);
  fVar191 = auVar145._0_4_;
  fVar218 = auVar145._4_4_;
  fVar211 = auVar145._8_4_;
  fVar231 = auVar145._12_4_;
  fVar212 = auVar197._0_4_;
  fVar232 = auVar197._4_4_;
  fVar213 = auVar197._8_4_;
  fVar233 = auVar197._12_4_;
  fVar214 = auVar147._0_4_;
  fVar234 = auVar147._4_4_;
  fVar215 = auVar147._8_4_;
  fVar236 = auVar147._12_4_;
  auVar310._0_4_ = fVar214 * auVar87._0_4_ + fVar212 * auVar14._0_4_ + fVar191 * auVar15._0_4_;
  auVar310._4_4_ = fVar234 * auVar87._4_4_ + fVar232 * auVar14._4_4_ + fVar218 * auVar15._4_4_;
  auVar310._8_4_ = fVar215 * auVar87._8_4_ + fVar213 * auVar14._8_4_ + fVar211 * auVar15._8_4_;
  auVar310._12_4_ = fVar236 * auVar87._12_4_ + fVar233 * auVar14._12_4_ + fVar231 * auVar15._12_4_;
  auVar310._16_4_ = fVar214 * auVar87._16_4_ + fVar212 * auVar14._16_4_ + fVar191 * auVar15._16_4_;
  auVar310._20_4_ = fVar234 * auVar87._20_4_ + fVar232 * auVar14._20_4_ + fVar218 * auVar15._20_4_;
  auVar310._24_4_ = fVar215 * auVar87._24_4_ + fVar213 * auVar14._24_4_ + fVar211 * auVar15._24_4_;
  auVar310._28_4_ = fVar233 + in_register_000015dc + in_register_0000151c;
  auVar303._0_4_ = fVar214 * auVar16._0_4_ + fVar212 * auVar17._0_4_ + auVar18._0_4_ * fVar191;
  auVar303._4_4_ = fVar234 * auVar16._4_4_ + fVar232 * auVar17._4_4_ + auVar18._4_4_ * fVar218;
  auVar303._8_4_ = fVar215 * auVar16._8_4_ + fVar213 * auVar17._8_4_ + auVar18._8_4_ * fVar211;
  auVar303._12_4_ = fVar236 * auVar16._12_4_ + fVar233 * auVar17._12_4_ + auVar18._12_4_ * fVar231;
  auVar303._16_4_ = fVar214 * auVar16._16_4_ + fVar212 * auVar17._16_4_ + auVar18._16_4_ * fVar191;
  auVar303._20_4_ = fVar234 * auVar16._20_4_ + fVar232 * auVar17._20_4_ + auVar18._20_4_ * fVar218;
  auVar303._24_4_ = fVar215 * auVar16._24_4_ + fVar213 * auVar17._24_4_ + auVar18._24_4_ * fVar211;
  auVar303._28_4_ = fVar233 + in_register_000015dc + in_register_0000159c;
  auVar207._0_4_ = fVar214 * auVar19._0_4_ + fVar212 * auVar20._0_4_ + auVar21._0_4_ * fVar191;
  auVar207._4_4_ = fVar234 * auVar19._4_4_ + fVar232 * auVar20._4_4_ + auVar21._4_4_ * fVar218;
  auVar207._8_4_ = fVar215 * auVar19._8_4_ + fVar213 * auVar20._8_4_ + auVar21._8_4_ * fVar211;
  auVar207._12_4_ = fVar236 * auVar19._12_4_ + fVar233 * auVar20._12_4_ + auVar21._12_4_ * fVar231;
  auVar207._16_4_ = fVar214 * auVar19._16_4_ + fVar212 * auVar20._16_4_ + auVar21._16_4_ * fVar191;
  auVar207._20_4_ = fVar234 * auVar19._20_4_ + fVar232 * auVar20._20_4_ + auVar21._20_4_ * fVar218;
  auVar207._24_4_ = fVar215 * auVar19._24_4_ + fVar213 * auVar20._24_4_ + auVar21._24_4_ * fVar211;
  auVar207._28_4_ = fVar236 + fVar233 + fVar231;
  auVar147 = vshufps_avx(auVar99,auVar99,0);
  auVar197 = vshufps_avx(auVar99,auVar99,0x55);
  auVar145 = vshufps_avx(auVar99,auVar99,0xaa);
  fVar218 = auVar145._0_4_;
  fVar211 = auVar145._4_4_;
  fVar231 = auVar145._8_4_;
  fVar212 = auVar145._12_4_;
  fVar234 = auVar197._0_4_;
  fVar215 = auVar197._4_4_;
  fVar236 = auVar197._8_4_;
  fVar216 = auVar197._12_4_;
  fVar232 = auVar147._0_4_;
  fVar213 = auVar147._4_4_;
  fVar233 = auVar147._8_4_;
  fVar214 = auVar147._12_4_;
  fVar191 = auVar87._28_4_;
  auVar121._0_4_ = fVar232 * auVar87._0_4_ + fVar234 * auVar14._0_4_ + fVar218 * auVar15._0_4_;
  auVar121._4_4_ = fVar213 * auVar87._4_4_ + fVar215 * auVar14._4_4_ + fVar211 * auVar15._4_4_;
  auVar121._8_4_ = fVar233 * auVar87._8_4_ + fVar236 * auVar14._8_4_ + fVar231 * auVar15._8_4_;
  auVar121._12_4_ = fVar214 * auVar87._12_4_ + fVar216 * auVar14._12_4_ + fVar212 * auVar15._12_4_;
  auVar121._16_4_ = fVar232 * auVar87._16_4_ + fVar234 * auVar14._16_4_ + fVar218 * auVar15._16_4_;
  auVar121._20_4_ = fVar213 * auVar87._20_4_ + fVar215 * auVar14._20_4_ + fVar211 * auVar15._20_4_;
  auVar121._24_4_ = fVar233 * auVar87._24_4_ + fVar236 * auVar14._24_4_ + fVar231 * auVar15._24_4_;
  auVar121._28_4_ = fVar191 + auVar14._28_4_ + auVar15._28_4_;
  auVar149._0_4_ = fVar232 * auVar16._0_4_ + auVar18._0_4_ * fVar218 + fVar234 * auVar17._0_4_;
  auVar149._4_4_ = fVar213 * auVar16._4_4_ + auVar18._4_4_ * fVar211 + fVar215 * auVar17._4_4_;
  auVar149._8_4_ = fVar233 * auVar16._8_4_ + auVar18._8_4_ * fVar231 + fVar236 * auVar17._8_4_;
  auVar149._12_4_ = fVar214 * auVar16._12_4_ + auVar18._12_4_ * fVar212 + fVar216 * auVar17._12_4_;
  auVar149._16_4_ = fVar232 * auVar16._16_4_ + auVar18._16_4_ * fVar218 + fVar234 * auVar17._16_4_;
  auVar149._20_4_ = fVar213 * auVar16._20_4_ + auVar18._20_4_ * fVar211 + fVar215 * auVar17._20_4_;
  auVar149._24_4_ = fVar233 * auVar16._24_4_ + auVar18._24_4_ * fVar231 + fVar236 * auVar17._24_4_;
  auVar149._28_4_ = fVar191 + auVar18._28_4_ + auVar15._28_4_;
  auVar164._8_4_ = 0x7fffffff;
  auVar164._0_8_ = 0x7fffffff7fffffff;
  auVar164._12_4_ = 0x7fffffff;
  auVar164._16_4_ = 0x7fffffff;
  auVar164._20_4_ = 0x7fffffff;
  auVar164._24_4_ = 0x7fffffff;
  auVar164._28_4_ = 0x7fffffff;
  auVar182._8_4_ = 0x219392ef;
  auVar182._0_8_ = 0x219392ef219392ef;
  auVar182._12_4_ = 0x219392ef;
  auVar182._16_4_ = 0x219392ef;
  auVar182._20_4_ = 0x219392ef;
  auVar182._24_4_ = 0x219392ef;
  auVar182._28_4_ = 0x219392ef;
  auVar87 = vandps_avx(auVar310,auVar164);
  auVar87 = vcmpps_avx(auVar87,auVar182,1);
  auVar14 = vblendvps_avx(auVar310,auVar182,auVar87);
  auVar87 = vandps_avx(auVar303,auVar164);
  auVar87 = vcmpps_avx(auVar87,auVar182,1);
  auVar15 = vblendvps_avx(auVar303,auVar182,auVar87);
  auVar87 = vandps_avx(auVar207,auVar164);
  auVar87 = vcmpps_avx(auVar87,auVar182,1);
  auVar87 = vblendvps_avx(auVar207,auVar182,auVar87);
  auVar165._0_4_ = fVar232 * auVar19._0_4_ + fVar234 * auVar20._0_4_ + auVar21._0_4_ * fVar218;
  auVar165._4_4_ = fVar213 * auVar19._4_4_ + fVar215 * auVar20._4_4_ + auVar21._4_4_ * fVar211;
  auVar165._8_4_ = fVar233 * auVar19._8_4_ + fVar236 * auVar20._8_4_ + auVar21._8_4_ * fVar231;
  auVar165._12_4_ = fVar214 * auVar19._12_4_ + fVar216 * auVar20._12_4_ + auVar21._12_4_ * fVar212;
  auVar165._16_4_ = fVar232 * auVar19._16_4_ + fVar234 * auVar20._16_4_ + auVar21._16_4_ * fVar218;
  auVar165._20_4_ = fVar213 * auVar19._20_4_ + fVar215 * auVar20._20_4_ + auVar21._20_4_ * fVar211;
  auVar165._24_4_ = fVar233 * auVar19._24_4_ + fVar236 * auVar20._24_4_ + auVar21._24_4_ * fVar231;
  auVar165._28_4_ = fVar191 + auVar17._28_4_ + fVar212;
  auVar16 = vrcpps_avx(auVar14);
  fVar191 = auVar16._0_4_;
  fVar211 = auVar16._4_4_;
  auVar17._4_4_ = auVar14._4_4_ * fVar211;
  auVar17._0_4_ = auVar14._0_4_ * fVar191;
  fVar212 = auVar16._8_4_;
  auVar17._8_4_ = auVar14._8_4_ * fVar212;
  fVar213 = auVar16._12_4_;
  auVar17._12_4_ = auVar14._12_4_ * fVar213;
  fVar214 = auVar16._16_4_;
  auVar17._16_4_ = auVar14._16_4_ * fVar214;
  fVar215 = auVar16._20_4_;
  auVar17._20_4_ = auVar14._20_4_ * fVar215;
  fVar216 = auVar16._24_4_;
  auVar17._24_4_ = auVar14._24_4_ * fVar216;
  auVar17._28_4_ = auVar207._28_4_;
  auVar247._8_4_ = 0x3f800000;
  auVar247._0_8_ = 0x3f8000003f800000;
  auVar247._12_4_ = 0x3f800000;
  auVar247._16_4_ = 0x3f800000;
  auVar247._20_4_ = 0x3f800000;
  auVar247._24_4_ = 0x3f800000;
  auVar247._28_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar247,auVar17);
  auVar14 = vrcpps_avx(auVar15);
  fVar191 = fVar191 + fVar191 * auVar17._0_4_;
  fVar211 = fVar211 + fVar211 * auVar17._4_4_;
  fVar212 = fVar212 + fVar212 * auVar17._8_4_;
  fVar213 = fVar213 + fVar213 * auVar17._12_4_;
  fVar214 = fVar214 + fVar214 * auVar17._16_4_;
  fVar215 = fVar215 + fVar215 * auVar17._20_4_;
  fVar216 = fVar216 + fVar216 * auVar17._24_4_;
  fVar218 = auVar14._0_4_;
  fVar231 = auVar14._4_4_;
  auVar18._4_4_ = auVar15._4_4_ * fVar231;
  auVar18._0_4_ = auVar15._0_4_ * fVar218;
  fVar232 = auVar14._8_4_;
  auVar18._8_4_ = auVar15._8_4_ * fVar232;
  fVar233 = auVar14._12_4_;
  auVar18._12_4_ = auVar15._12_4_ * fVar233;
  fVar234 = auVar14._16_4_;
  auVar18._16_4_ = auVar15._16_4_ * fVar234;
  fVar236 = auVar14._20_4_;
  auVar18._20_4_ = auVar15._20_4_ * fVar236;
  fVar237 = auVar14._24_4_;
  auVar18._24_4_ = auVar15._24_4_ * fVar237;
  auVar18._28_4_ = auVar16._28_4_;
  auVar14 = vsubps_avx(auVar247,auVar18);
  fVar218 = fVar218 + fVar218 * auVar14._0_4_;
  fVar231 = fVar231 + fVar231 * auVar14._4_4_;
  fVar232 = fVar232 + fVar232 * auVar14._8_4_;
  fVar233 = fVar233 + fVar233 * auVar14._12_4_;
  fVar234 = fVar234 + fVar234 * auVar14._16_4_;
  fVar236 = fVar236 + fVar236 * auVar14._20_4_;
  fVar237 = fVar237 + fVar237 * auVar14._24_4_;
  auVar14 = vrcpps_avx(auVar87);
  fVar168 = auVar14._0_4_;
  fVar185 = auVar14._4_4_;
  auVar15._4_4_ = fVar185 * auVar87._4_4_;
  auVar15._0_4_ = fVar168 * auVar87._0_4_;
  fVar186 = auVar14._8_4_;
  auVar15._8_4_ = fVar186 * auVar87._8_4_;
  fVar187 = auVar14._12_4_;
  auVar15._12_4_ = fVar187 * auVar87._12_4_;
  fVar188 = auVar14._16_4_;
  auVar15._16_4_ = fVar188 * auVar87._16_4_;
  fVar189 = auVar14._20_4_;
  auVar15._20_4_ = fVar189 * auVar87._20_4_;
  fVar190 = auVar14._24_4_;
  auVar15._24_4_ = fVar190 * auVar87._24_4_;
  auVar15._28_4_ = auVar87._28_4_;
  auVar87 = vsubps_avx(auVar247,auVar15);
  fVar168 = fVar168 + fVar168 * auVar87._0_4_;
  fVar185 = fVar185 + fVar185 * auVar87._4_4_;
  fVar186 = fVar186 + fVar186 * auVar87._8_4_;
  fVar187 = fVar187 + fVar187 * auVar87._12_4_;
  fVar188 = fVar188 + fVar188 * auVar87._16_4_;
  fVar189 = fVar189 + fVar189 * auVar87._20_4_;
  fVar190 = fVar190 + fVar190 * auVar87._24_4_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar147 = vpmovsxwd_avx(auVar147);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar65 * 7 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar197);
  auVar88._16_16_ = auVar197;
  auVar88._0_16_ = auVar147;
  auVar87 = vcvtdq2ps_avx(auVar88);
  auVar87 = vsubps_avx(auVar87,auVar121);
  auVar72._0_4_ = fVar191 * auVar87._0_4_;
  auVar72._4_4_ = fVar211 * auVar87._4_4_;
  auVar72._8_4_ = fVar212 * auVar87._8_4_;
  auVar72._12_4_ = fVar213 * auVar87._12_4_;
  auVar16._16_4_ = fVar214 * auVar87._16_4_;
  auVar16._0_16_ = auVar72;
  auVar16._20_4_ = fVar215 * auVar87._20_4_;
  auVar16._24_4_ = fVar216 * auVar87._24_4_;
  auVar16._28_4_ = auVar87._28_4_;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + lVar12 + 6);
  auVar147 = vpmovsxwd_avx(auVar145);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + lVar12 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar4);
  auVar248._16_16_ = auVar197;
  auVar248._0_16_ = auVar147;
  auVar87 = vcvtdq2ps_avx(auVar248);
  auVar87 = vsubps_avx(auVar87,auVar121);
  auVar100._0_4_ = fVar191 * auVar87._0_4_;
  auVar100._4_4_ = fVar211 * auVar87._4_4_;
  auVar100._8_4_ = fVar212 * auVar87._8_4_;
  auVar100._12_4_ = fVar213 * auVar87._12_4_;
  auVar19._16_4_ = fVar214 * auVar87._16_4_;
  auVar19._0_16_ = auVar100;
  auVar19._20_4_ = fVar215 * auVar87._20_4_;
  auVar19._24_4_ = fVar216 * auVar87._24_4_;
  auVar19._28_4_ = auVar87._28_4_;
  lVar68 = (ulong)(byte)PVar7 * 0x10;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = *(ulong *)(prim + lVar68 + 6);
  auVar147 = vpmovsxwd_avx(auVar298);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + lVar68 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar5);
  lVar68 = lVar68 + uVar65 * -2;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + lVar68 + 6);
  auVar145 = vpmovsxwd_avx(auVar116);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + lVar68 + 0xe);
  auVar4 = vpmovsxwd_avx(auVar105);
  auVar208._16_16_ = auVar4;
  auVar208._0_16_ = auVar145;
  auVar87 = vcvtdq2ps_avx(auVar208);
  auVar87 = vsubps_avx(auVar87,auVar149);
  auVar193._0_4_ = fVar218 * auVar87._0_4_;
  auVar193._4_4_ = fVar231 * auVar87._4_4_;
  auVar193._8_4_ = fVar232 * auVar87._8_4_;
  auVar193._12_4_ = fVar233 * auVar87._12_4_;
  auVar20._16_4_ = fVar234 * auVar87._16_4_;
  auVar20._0_16_ = auVar193;
  auVar20._20_4_ = fVar236 * auVar87._20_4_;
  auVar20._24_4_ = fVar237 * auVar87._24_4_;
  auVar20._28_4_ = auVar87._28_4_;
  auVar249._16_16_ = auVar197;
  auVar249._0_16_ = auVar147;
  auVar87 = vcvtdq2ps_avx(auVar249);
  auVar87 = vsubps_avx(auVar87,auVar149);
  auVar130._0_4_ = fVar218 * auVar87._0_4_;
  auVar130._4_4_ = fVar231 * auVar87._4_4_;
  auVar130._8_4_ = fVar232 * auVar87._8_4_;
  auVar130._12_4_ = fVar233 * auVar87._12_4_;
  auVar21._16_4_ = fVar234 * auVar87._16_4_;
  auVar21._0_16_ = auVar130;
  auVar21._20_4_ = fVar236 * auVar87._20_4_;
  auVar21._24_4_ = fVar237 * auVar87._24_4_;
  auVar21._28_4_ = auVar87._28_4_;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + uVar69 + uVar65 + 6);
  auVar147 = vpmovsxwd_avx(auVar135);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar69 + uVar65 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar106);
  auVar228._16_16_ = auVar197;
  auVar228._0_16_ = auVar147;
  auVar87 = vcvtdq2ps_avx(auVar228);
  auVar87 = vsubps_avx(auVar87,auVar165);
  auVar219._0_4_ = fVar168 * auVar87._0_4_;
  auVar219._4_4_ = fVar185 * auVar87._4_4_;
  auVar219._8_4_ = fVar186 * auVar87._8_4_;
  auVar219._12_4_ = fVar187 * auVar87._12_4_;
  auVar22._16_4_ = fVar188 * auVar87._16_4_;
  auVar22._0_16_ = auVar219;
  auVar22._20_4_ = fVar189 * auVar87._20_4_;
  auVar22._24_4_ = fVar190 * auVar87._24_4_;
  auVar22._28_4_ = auVar87._28_4_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = *(ulong *)(prim + uVar65 * 0x17 + 6);
  auVar147 = vpmovsxwd_avx(auVar235);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar65 * 0x17 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar6);
  auVar250._16_16_ = auVar197;
  auVar250._0_16_ = auVar147;
  auVar87 = vcvtdq2ps_avx(auVar250);
  auVar87 = vsubps_avx(auVar87,auVar165);
  auVar154._0_4_ = fVar168 * auVar87._0_4_;
  auVar154._4_4_ = fVar185 * auVar87._4_4_;
  auVar154._8_4_ = fVar186 * auVar87._8_4_;
  auVar154._12_4_ = fVar187 * auVar87._12_4_;
  auVar23._16_4_ = fVar188 * auVar87._16_4_;
  auVar23._0_16_ = auVar154;
  auVar23._20_4_ = fVar189 * auVar87._20_4_;
  auVar23._24_4_ = fVar190 * auVar87._24_4_;
  auVar23._28_4_ = auVar87._28_4_;
  auVar147 = vpminsd_avx(auVar16._16_16_,auVar19._16_16_);
  auVar197 = vpminsd_avx(auVar72,auVar100);
  auVar294._16_16_ = auVar147;
  auVar294._0_16_ = auVar197;
  auVar147 = vpminsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar197 = vpminsd_avx(auVar193,auVar130);
  auVar304._16_16_ = auVar147;
  auVar304._0_16_ = auVar197;
  auVar87 = vmaxps_avx(auVar294,auVar304);
  auVar147 = vpminsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar197 = vpminsd_avx(auVar219,auVar154);
  auVar321._16_16_ = auVar147;
  auVar321._0_16_ = auVar197;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar327._4_4_ = uVar2;
  auVar327._0_4_ = uVar2;
  auVar327._8_4_ = uVar2;
  auVar327._12_4_ = uVar2;
  auVar327._16_4_ = uVar2;
  auVar327._20_4_ = uVar2;
  auVar327._24_4_ = uVar2;
  auVar327._28_4_ = uVar2;
  auVar14 = vmaxps_avx(auVar321,auVar327);
  auVar87 = vmaxps_avx(auVar87,auVar14);
  local_2e0._4_4_ = auVar87._4_4_ * 0.99999964;
  local_2e0._0_4_ = auVar87._0_4_ * 0.99999964;
  local_2e0._8_4_ = auVar87._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar87._12_4_ * 0.99999964;
  local_2e0._16_4_ = auVar87._16_4_ * 0.99999964;
  local_2e0._20_4_ = auVar87._20_4_ * 0.99999964;
  local_2e0._24_4_ = auVar87._24_4_ * 0.99999964;
  local_2e0._28_4_ = auVar87._28_4_;
  auVar147 = vpmaxsd_avx(auVar16._16_16_,auVar19._16_16_);
  auVar197 = vpmaxsd_avx(auVar72,auVar100);
  auVar89._16_16_ = auVar147;
  auVar89._0_16_ = auVar197;
  auVar147 = vpmaxsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar197 = vpmaxsd_avx(auVar193,auVar130);
  auVar122._16_16_ = auVar147;
  auVar122._0_16_ = auVar197;
  auVar87 = vminps_avx(auVar89,auVar122);
  auVar147 = vpmaxsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar197 = vpmaxsd_avx(auVar219,auVar154);
  auVar123._16_16_ = auVar147;
  auVar123._0_16_ = auVar197;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar150._4_4_ = uVar2;
  auVar150._0_4_ = uVar2;
  auVar150._8_4_ = uVar2;
  auVar150._12_4_ = uVar2;
  auVar150._16_4_ = uVar2;
  auVar150._20_4_ = uVar2;
  auVar150._24_4_ = uVar2;
  auVar150._28_4_ = uVar2;
  auVar14 = vminps_avx(auVar123,auVar150);
  auVar87 = vminps_avx(auVar87,auVar14);
  auVar14._4_4_ = auVar87._4_4_ * 1.0000004;
  auVar14._0_4_ = auVar87._0_4_ * 1.0000004;
  auVar14._8_4_ = auVar87._8_4_ * 1.0000004;
  auVar14._12_4_ = auVar87._12_4_ * 1.0000004;
  auVar14._16_4_ = auVar87._16_4_ * 1.0000004;
  auVar14._20_4_ = auVar87._20_4_ * 1.0000004;
  auVar14._24_4_ = auVar87._24_4_ * 1.0000004;
  auVar14._28_4_ = auVar87._28_4_;
  auVar87 = vcmpps_avx(local_2e0,auVar14,2);
  auVar147 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar124._16_16_ = auVar147;
  auVar124._0_16_ = auVar147;
  auVar14 = vcvtdq2ps_avx(auVar124);
  auVar14 = vcmpps_avx(_DAT_01faff40,auVar14,1);
  auVar87 = vandps_avx(auVar87,auVar14);
  uVar62 = vmovmskps_avx(auVar87);
  if (uVar62 == 0) {
    return false;
  }
  uVar62 = uVar62 & 0xff;
  auVar90._16_16_ = mm_lookupmask_ps._240_16_;
  auVar90._0_16_ = mm_lookupmask_ps._240_16_;
  uVar66 = 1 << ((byte)k & 0x1f);
  local_2c0 = vblendps_avx(auVar90,ZEXT832(0) << 0x20,0x80);
LAB_0109b459:
  uVar65 = (ulong)uVar62;
  lVar68 = 0;
  if (uVar65 != 0) {
    for (; (uVar62 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
    }
  }
  uVar62 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar62].ptr;
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar68 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar147 = *(undefined1 (*) [16])(_Var11 + uVar69 * (long)pvVar10);
  pfVar1 = (float *)(_Var11 + (uVar69 + 1) * (long)pvVar10);
  fVar191 = *pfVar1;
  fVar218 = pfVar1[1];
  fVar211 = pfVar1[2];
  fVar231 = pfVar1[3];
  pfVar1 = (float *)(_Var11 + (uVar69 + 2) * (long)pvVar10);
  fVar212 = *pfVar1;
  fVar232 = pfVar1[1];
  fVar213 = pfVar1[2];
  fVar233 = pfVar1[3];
  pfVar1 = (float *)(_Var11 + (long)pvVar10 * (uVar69 + 3));
  fVar214 = *pfVar1;
  fVar234 = pfVar1[1];
  fVar215 = pfVar1[2];
  fVar236 = pfVar1[3];
  uVar65 = uVar65 - 1 & uVar65;
  lVar12 = *(long *)&pGVar8[1].time_range.upper;
  pfVar1 = (float *)(lVar12 + (long)p_Var9 * uVar69);
  fVar216 = *pfVar1;
  fVar237 = pfVar1[1];
  fVar168 = pfVar1[2];
  fVar185 = pfVar1[3];
  pfVar1 = (float *)(lVar12 + (long)p_Var9 * (uVar69 + 1));
  fVar186 = *pfVar1;
  fVar187 = pfVar1[1];
  fVar188 = pfVar1[2];
  fVar189 = pfVar1[3];
  pfVar1 = (float *)(lVar12 + (long)p_Var9 * (uVar69 + 2));
  fVar190 = *pfVar1;
  fVar98 = pfVar1[1];
  fVar167 = pfVar1[2];
  fVar217 = pfVar1[3];
  lVar13 = 0;
  if (uVar65 != 0) {
    for (; (uVar65 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  pfVar1 = (float *)(lVar12 + (long)p_Var9 * (uVar69 + 3));
  fVar252 = *pfVar1;
  fVar253 = pfVar1[1];
  fVar262 = pfVar1[2];
  fVar263 = pfVar1[3];
  if (((uVar65 != 0) && (uVar69 = uVar65 - 1 & uVar65, uVar69 != 0)) && (lVar12 = 0, uVar69 != 0)) {
    for (; (uVar69 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  auVar197 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar145 = vinsertps_avx(auVar197,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar101._0_4_ = fVar186 * 0.0 + fVar190 * 0.5 + fVar252 * 0.0;
  auVar101._4_4_ = fVar187 * 0.0 + fVar98 * 0.5 + fVar253 * 0.0;
  auVar101._8_4_ = fVar188 * 0.0 + fVar167 * 0.5 + fVar262 * 0.0;
  auVar101._12_4_ = fVar189 * 0.0 + fVar217 * 0.5 + fVar263 * 0.0;
  auVar296._0_4_ = fVar216 * 0.5;
  auVar296._4_4_ = fVar237 * 0.5;
  auVar296._8_4_ = fVar168 * 0.5;
  auVar296._12_4_ = fVar185 * 0.5;
  auVar135 = vsubps_avx(auVar101,auVar296);
  auVar297._0_4_ = fVar191 * 0.0 + fVar212 * 0.5 + fVar214 * 0.0;
  auVar297._4_4_ = fVar218 * 0.0 + fVar232 * 0.5 + fVar234 * 0.0;
  auVar297._8_4_ = fVar211 * 0.0 + fVar213 * 0.5 + fVar215 * 0.0;
  auVar297._12_4_ = fVar231 * 0.0 + fVar233 * 0.5 + fVar236 * 0.0;
  fVar306 = auVar147._0_4_;
  auVar329._0_4_ = fVar306 * 0.5;
  fVar264 = auVar147._4_4_;
  auVar329._4_4_ = fVar264 * 0.5;
  fVar311 = auVar147._8_4_;
  auVar329._8_4_ = fVar311 * 0.5;
  fVar265 = auVar147._12_4_;
  auVar329._12_4_ = fVar265 * 0.5;
  auVar298 = vsubps_avx(auVar297,auVar329);
  local_690._0_4_ = fVar186 + fVar190 * 0.0 + fVar252 * -0.0 + fVar216 * -0.0;
  local_690._4_4_ = fVar187 + fVar98 * 0.0 + fVar253 * -0.0 + fVar237 * -0.0;
  fStack_688 = fVar188 + fVar167 * 0.0 + fVar262 * -0.0 + fVar168 * -0.0;
  fStack_684 = fVar189 + fVar217 * 0.0 + fVar263 * -0.0 + fVar185 * -0.0;
  local_680._0_4_ = fVar216 * -0.0 + fVar186 * 0.0 + fVar190 + fVar252 * -0.0;
  local_680._4_4_ = fVar237 * -0.0 + fVar187 * 0.0 + fVar98 + fVar253 * -0.0;
  fStack_678 = fVar168 * -0.0 + fVar188 * 0.0 + fVar167 + fVar262 * -0.0;
  fStack_674 = fVar185 * -0.0 + fVar189 * 0.0 + fVar217 + fVar263 * -0.0;
  auVar288._0_4_ = fVar190 * 0.0 + fVar252 * 0.5;
  auVar288._4_4_ = fVar98 * 0.0 + fVar253 * 0.5;
  auVar288._8_4_ = fVar167 * 0.0 + fVar262 * 0.5;
  auVar288._12_4_ = fVar217 * 0.0 + fVar263 * 0.5;
  auVar268._0_4_ = fVar186 * 0.5;
  auVar268._4_4_ = fVar187 * 0.5;
  auVar268._8_4_ = fVar188 * 0.5;
  auVar268._12_4_ = fVar189 * 0.5;
  auVar147 = vsubps_avx(auVar288,auVar268);
  auVar307._0_4_ = fVar306 * -0.0 + fVar214 * -0.0 + fVar212 * 0.0 + fVar191;
  auVar307._4_4_ = fVar264 * -0.0 + fVar234 * -0.0 + fVar232 * 0.0 + fVar218;
  auVar307._8_4_ = fVar311 * -0.0 + fVar215 * -0.0 + fVar213 * 0.0 + fVar211;
  auVar307._12_4_ = fVar265 * -0.0 + fVar236 * -0.0 + fVar233 * 0.0 + fVar231;
  auVar220._0_4_ = auVar147._0_4_ + fVar216 * 0.0;
  auVar220._4_4_ = auVar147._4_4_ + fVar237 * 0.0;
  auVar220._8_4_ = auVar147._8_4_ + fVar168 * 0.0;
  auVar220._12_4_ = auVar147._12_4_ + fVar185 * 0.0;
  auVar269._0_4_ = fVar306 * -0.0 + fVar191 * 0.0 + fVar212 + fVar214 * -0.0;
  auVar269._4_4_ = fVar264 * -0.0 + fVar218 * 0.0 + fVar232 + fVar234 * -0.0;
  auVar269._8_4_ = fVar311 * -0.0 + fVar211 * 0.0 + fVar213 + fVar215 * -0.0;
  auVar269._12_4_ = fVar265 * -0.0 + fVar231 * 0.0 + fVar233 + fVar236 * -0.0;
  auVar155._0_4_ = fVar212 * 0.0 + fVar214 * 0.5;
  auVar155._4_4_ = fVar232 * 0.0 + fVar234 * 0.5;
  auVar155._8_4_ = fVar213 * 0.0 + fVar215 * 0.5;
  auVar155._12_4_ = fVar233 * 0.0 + fVar236 * 0.5;
  auVar194._0_4_ = fVar191 * 0.5;
  auVar194._4_4_ = fVar218 * 0.5;
  auVar194._8_4_ = fVar211 * 0.5;
  auVar194._12_4_ = fVar231 * 0.5;
  auVar147 = vsubps_avx(auVar155,auVar194);
  auVar195._0_4_ = fVar306 * 0.0 + auVar147._0_4_;
  auVar195._4_4_ = fVar264 * 0.0 + auVar147._4_4_;
  auVar195._8_4_ = fVar311 * 0.0 + auVar147._8_4_;
  auVar195._12_4_ = fVar265 * 0.0 + auVar147._12_4_;
  auVar147 = vshufps_avx(auVar135,auVar135,0xc9);
  auVar197 = vshufps_avx(auVar307,auVar307,0xc9);
  fVar186 = auVar135._0_4_;
  auVar238._0_4_ = fVar186 * auVar197._0_4_;
  fVar188 = auVar135._4_4_;
  auVar238._4_4_ = fVar188 * auVar197._4_4_;
  fVar190 = auVar135._8_4_;
  auVar238._8_4_ = fVar190 * auVar197._8_4_;
  fVar98 = auVar135._12_4_;
  auVar238._12_4_ = fVar98 * auVar197._12_4_;
  auVar254._0_4_ = auVar307._0_4_ * auVar147._0_4_;
  auVar254._4_4_ = auVar307._4_4_ * auVar147._4_4_;
  auVar254._8_4_ = auVar307._8_4_ * auVar147._8_4_;
  auVar254._12_4_ = auVar307._12_4_ * auVar147._12_4_;
  auVar197 = vsubps_avx(auVar254,auVar238);
  auVar4 = vshufps_avx(auVar197,auVar197,0xc9);
  auVar197 = vshufps_avx(auVar298,auVar298,0xc9);
  auVar239._0_4_ = fVar186 * auVar197._0_4_;
  auVar239._4_4_ = fVar188 * auVar197._4_4_;
  auVar239._8_4_ = fVar190 * auVar197._8_4_;
  auVar239._12_4_ = fVar98 * auVar197._12_4_;
  auVar156._0_4_ = auVar298._0_4_ * auVar147._0_4_;
  auVar156._4_4_ = auVar298._4_4_ * auVar147._4_4_;
  auVar156._8_4_ = auVar298._8_4_ * auVar147._8_4_;
  auVar156._12_4_ = auVar298._12_4_ * auVar147._12_4_;
  auVar147 = vsubps_avx(auVar156,auVar239);
  auVar298 = vshufps_avx(auVar147,auVar147,0xc9);
  auVar197 = vshufps_avx(auVar220,auVar220,0xc9);
  auVar147 = vshufps_avx(auVar269,auVar269,0xc9);
  auVar157._0_4_ = auVar220._0_4_ * auVar147._0_4_;
  auVar157._4_4_ = auVar220._4_4_ * auVar147._4_4_;
  auVar157._8_4_ = auVar220._8_4_ * auVar147._8_4_;
  auVar157._12_4_ = auVar220._12_4_ * auVar147._12_4_;
  auVar270._0_4_ = auVar269._0_4_ * auVar197._0_4_;
  auVar270._4_4_ = auVar269._4_4_ * auVar197._4_4_;
  auVar270._8_4_ = auVar269._8_4_ * auVar197._8_4_;
  auVar270._12_4_ = auVar269._12_4_ * auVar197._12_4_;
  auVar147 = vsubps_avx(auVar270,auVar157);
  auVar5 = vshufps_avx(auVar147,auVar147,0xc9);
  auVar147 = vshufps_avx(auVar195,auVar195,0xc9);
  auVar271._0_4_ = auVar147._0_4_ * auVar220._0_4_;
  auVar271._4_4_ = auVar147._4_4_ * auVar220._4_4_;
  auVar271._8_4_ = auVar147._8_4_ * auVar220._8_4_;
  auVar271._12_4_ = auVar147._12_4_ * auVar220._12_4_;
  auVar147 = vdpps_avx(auVar4,auVar4,0x7f);
  auVar196._0_4_ = auVar197._0_4_ * auVar195._0_4_;
  auVar196._4_4_ = auVar197._4_4_ * auVar195._4_4_;
  auVar196._8_4_ = auVar197._8_4_ * auVar195._8_4_;
  auVar196._12_4_ = auVar197._12_4_ * auVar195._12_4_;
  auVar197 = vsubps_avx(auVar196,auVar271);
  auVar116 = vshufps_avx(auVar197,auVar197,0xc9);
  fVar212 = auVar147._0_4_;
  auVar235 = ZEXT416((uint)fVar212);
  auVar197 = vrsqrtss_avx(auVar235,auVar235);
  fVar191 = auVar197._0_4_;
  auVar197 = ZEXT416((uint)(fVar191 * 1.5 - fVar212 * 0.5 * fVar191 * fVar191 * fVar191));
  auVar105 = vshufps_avx(auVar197,auVar197,0);
  auVar197 = vdpps_avx(auVar4,auVar298,0x7f);
  fVar191 = auVar4._0_4_ * auVar105._0_4_;
  fVar218 = auVar4._4_4_ * auVar105._4_4_;
  fVar211 = auVar4._8_4_ * auVar105._8_4_;
  fVar231 = auVar4._12_4_ * auVar105._12_4_;
  auVar147 = vshufps_avx(auVar147,auVar147,0);
  auVar289._0_4_ = auVar298._0_4_ * auVar147._0_4_;
  auVar289._4_4_ = auVar298._4_4_ * auVar147._4_4_;
  auVar289._8_4_ = auVar298._8_4_ * auVar147._8_4_;
  auVar289._12_4_ = auVar298._12_4_ * auVar147._12_4_;
  auVar147 = vshufps_avx(auVar197,auVar197,0);
  auVar255._0_4_ = auVar4._0_4_ * auVar147._0_4_;
  auVar255._4_4_ = auVar4._4_4_ * auVar147._4_4_;
  auVar255._8_4_ = auVar4._8_4_ * auVar147._8_4_;
  auVar255._12_4_ = auVar4._12_4_ * auVar147._12_4_;
  auVar106 = vsubps_avx(auVar289,auVar255);
  auVar147 = vrcpss_avx(auVar235,auVar235);
  auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar212 * auVar147._0_4_)));
  auVar4 = vshufps_avx(auVar147,auVar147,0);
  auVar147 = vdpps_avx(auVar5,auVar5,0x7f);
  fVar212 = auVar147._0_4_;
  auVar235 = ZEXT416((uint)fVar212);
  auVar197 = vrsqrtss_avx(auVar235,auVar235);
  fVar232 = auVar197._0_4_;
  auVar197 = vdpps_avx(auVar5,auVar116,0x7f);
  auVar298 = ZEXT416((uint)(fVar232 * 1.5 - fVar212 * 0.5 * fVar232 * fVar232 * fVar232));
  auVar298 = vshufps_avx(auVar298,auVar298,0);
  fVar232 = auVar298._0_4_ * auVar5._0_4_;
  fVar213 = auVar298._4_4_ * auVar5._4_4_;
  fVar233 = auVar298._8_4_ * auVar5._8_4_;
  fVar214 = auVar298._12_4_ * auVar5._12_4_;
  auVar147 = vshufps_avx(auVar147,auVar147,0);
  auVar240._0_4_ = auVar147._0_4_ * auVar116._0_4_;
  auVar240._4_4_ = auVar147._4_4_ * auVar116._4_4_;
  auVar240._8_4_ = auVar147._8_4_ * auVar116._8_4_;
  auVar240._12_4_ = auVar147._12_4_ * auVar116._12_4_;
  auVar147 = vshufps_avx(auVar197,auVar197,0);
  auVar158._0_4_ = auVar147._0_4_ * auVar5._0_4_;
  auVar158._4_4_ = auVar147._4_4_ * auVar5._4_4_;
  auVar158._8_4_ = auVar147._8_4_ * auVar5._8_4_;
  auVar158._12_4_ = auVar147._12_4_ * auVar5._12_4_;
  auVar116 = vsubps_avx(auVar240,auVar158);
  auVar147 = vrcpss_avx(auVar235,auVar235);
  auVar147 = ZEXT416((uint)((2.0 - fVar212 * auVar147._0_4_) * auVar147._0_4_));
  auVar147 = vshufps_avx(auVar147,auVar147,0);
  auVar197 = vshufps_avx(_local_690,_local_690,0xff);
  auVar272._0_4_ = auVar197._0_4_ * fVar191;
  auVar272._4_4_ = auVar197._4_4_ * fVar218;
  auVar272._8_4_ = auVar197._8_4_ * fVar211;
  auVar272._12_4_ = auVar197._12_4_ * fVar231;
  _local_4e0 = vsubps_avx(_local_690,auVar272);
  auVar5 = vshufps_avx(auVar135,auVar135,0xff);
  auVar198._0_4_ =
       auVar5._0_4_ * fVar191 + auVar105._0_4_ * auVar106._0_4_ * auVar4._0_4_ * auVar197._0_4_;
  auVar198._4_4_ =
       auVar5._4_4_ * fVar218 + auVar105._4_4_ * auVar106._4_4_ * auVar4._4_4_ * auVar197._4_4_;
  auVar198._8_4_ =
       auVar5._8_4_ * fVar211 + auVar105._8_4_ * auVar106._8_4_ * auVar4._8_4_ * auVar197._8_4_;
  auVar198._12_4_ =
       auVar5._12_4_ * fVar231 + auVar105._12_4_ * auVar106._12_4_ * auVar4._12_4_ * auVar197._12_4_
  ;
  auVar5 = vsubps_avx(auVar135,auVar198);
  local_4f0._0_4_ = auVar272._0_4_ + (float)local_690._0_4_;
  local_4f0._4_4_ = auVar272._4_4_ + (float)local_690._4_4_;
  fStack_4e8 = auVar272._8_4_ + fStack_688;
  fStack_4e4 = auVar272._12_4_ + fStack_684;
  auVar197 = vshufps_avx(_local_680,_local_680,0xff);
  auVar169._0_4_ = fVar232 * auVar197._0_4_;
  auVar169._4_4_ = fVar213 * auVar197._4_4_;
  auVar169._8_4_ = fVar233 * auVar197._8_4_;
  auVar169._12_4_ = fVar214 * auVar197._12_4_;
  _local_500 = vsubps_avx(_local_680,auVar169);
  auVar4 = vshufps_avx(auVar220,auVar220,0xff);
  auVar102._0_4_ =
       fVar232 * auVar4._0_4_ + auVar197._0_4_ * auVar298._0_4_ * auVar116._0_4_ * auVar147._0_4_;
  auVar102._4_4_ =
       fVar213 * auVar4._4_4_ + auVar197._4_4_ * auVar298._4_4_ * auVar116._4_4_ * auVar147._4_4_;
  auVar102._8_4_ =
       fVar233 * auVar4._8_4_ + auVar197._8_4_ * auVar298._8_4_ * auVar116._8_4_ * auVar147._8_4_;
  auVar102._12_4_ =
       fVar214 * auVar4._12_4_ +
       auVar197._12_4_ * auVar298._12_4_ * auVar116._12_4_ * auVar147._12_4_;
  auVar298 = vsubps_avx(auVar220,auVar102);
  local_510._0_4_ = (float)local_680._0_4_ + auVar169._0_4_;
  local_510._4_4_ = (float)local_680._4_4_ + auVar169._4_4_;
  fStack_508 = fStack_678 + auVar169._8_4_;
  fStack_504 = fStack_674 + auVar169._12_4_;
  local_520._0_4_ = local_4e0._0_4_ + auVar5._0_4_ * 0.33333334;
  local_520._4_4_ = local_4e0._4_4_ + auVar5._4_4_ * 0.33333334;
  fStack_518 = local_4e0._8_4_ + auVar5._8_4_ * 0.33333334;
  fStack_514 = local_4e0._12_4_ + auVar5._12_4_ * 0.33333334;
  local_3a0 = vsubps_avx(_local_4e0,auVar145);
  auVar197 = vmovsldup_avx(local_3a0);
  auVar147 = vmovshdup_avx(local_3a0);
  auVar4 = vshufps_avx(local_3a0,local_3a0,0xaa);
  fVar191 = pre->ray_space[k].vx.field_0.m128[0];
  fVar218 = pre->ray_space[k].vx.field_0.m128[1];
  fVar211 = pre->ray_space[k].vx.field_0.m128[2];
  fVar231 = pre->ray_space[k].vx.field_0.m128[3];
  fVar212 = pre->ray_space[k].vy.field_0.m128[0];
  fVar232 = pre->ray_space[k].vy.field_0.m128[1];
  fVar213 = pre->ray_space[k].vy.field_0.m128[2];
  fVar233 = pre->ray_space[k].vy.field_0.m128[3];
  fVar214 = pre->ray_space[k].vz.field_0.m128[0];
  fVar234 = pre->ray_space[k].vz.field_0.m128[1];
  fVar215 = pre->ray_space[k].vz.field_0.m128[2];
  fVar236 = pre->ray_space[k].vz.field_0.m128[3];
  fVar187 = fVar191 * auVar197._0_4_ + auVar4._0_4_ * fVar214 + fVar212 * auVar147._0_4_;
  fVar189 = fVar218 * auVar197._4_4_ + auVar4._4_4_ * fVar234 + fVar232 * auVar147._4_4_;
  local_690._4_4_ = fVar189;
  local_690._0_4_ = fVar187;
  fStack_688 = fVar211 * auVar197._8_4_ + auVar4._8_4_ * fVar215 + fVar213 * auVar147._8_4_;
  fStack_684 = fVar231 * auVar197._12_4_ + auVar4._12_4_ * fVar236 + fVar233 * auVar147._12_4_;
  local_3b0 = vsubps_avx(_local_520,auVar145);
  auVar4 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar147 = vmovshdup_avx(local_3b0);
  auVar197 = vmovsldup_avx(local_3b0);
  fVar216 = auVar197._0_4_ * fVar191 + auVar147._0_4_ * fVar212 + fVar214 * auVar4._0_4_;
  fVar168 = auVar197._4_4_ * fVar218 + auVar147._4_4_ * fVar232 + fVar234 * auVar4._4_4_;
  local_620._4_4_ = fVar168;
  local_620._0_4_ = fVar216;
  fStack_618 = auVar197._8_4_ * fVar211 + auVar147._8_4_ * fVar213 + fVar215 * auVar4._8_4_;
  fStack_614 = auVar197._12_4_ * fVar231 + auVar147._12_4_ * fVar233 + fVar236 * auVar4._12_4_;
  auVar199._0_4_ = auVar298._0_4_ * 0.33333334;
  auVar199._4_4_ = auVar298._4_4_ * 0.33333334;
  auVar199._8_4_ = auVar298._8_4_ * 0.33333334;
  auVar199._12_4_ = auVar298._12_4_ * 0.33333334;
  _local_530 = vsubps_avx(_local_500,auVar199);
  local_3c0 = vsubps_avx(_local_530,auVar145);
  auVar4 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar147 = vmovshdup_avx(local_3c0);
  auVar197 = vmovsldup_avx(local_3c0);
  auVar318._0_4_ = auVar197._0_4_ * fVar191 + auVar147._0_4_ * fVar212 + fVar214 * auVar4._0_4_;
  auVar318._4_4_ = auVar197._4_4_ * fVar218 + auVar147._4_4_ * fVar232 + fVar234 * auVar4._4_4_;
  auVar318._8_4_ = auVar197._8_4_ * fVar211 + auVar147._8_4_ * fVar213 + fVar215 * auVar4._8_4_;
  auVar318._12_4_ = auVar197._12_4_ * fVar231 + auVar147._12_4_ * fVar233 + fVar236 * auVar4._12_4_;
  local_3d0 = vsubps_avx(_local_500,auVar145);
  auVar4 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar147 = vmovshdup_avx(local_3d0);
  auVar197 = vmovsldup_avx(local_3d0);
  fVar237 = auVar197._0_4_ * fVar191 + auVar147._0_4_ * fVar212 + auVar4._0_4_ * fVar214;
  fVar185 = auVar197._4_4_ * fVar218 + auVar147._4_4_ * fVar232 + auVar4._4_4_ * fVar234;
  local_660._4_4_ = fVar185;
  local_660._0_4_ = fVar237;
  fStack_658 = auVar197._8_4_ * fVar211 + auVar147._8_4_ * fVar213 + auVar4._8_4_ * fVar215;
  fStack_654 = auVar197._12_4_ * fVar231 + auVar147._12_4_ * fVar233 + auVar4._12_4_ * fVar236;
  local_3e0 = vsubps_avx(_local_4f0,auVar145);
  auVar4 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar147 = vmovshdup_avx(local_3e0);
  auVar197 = vmovsldup_avx(local_3e0);
  auVar290._0_4_ = auVar197._0_4_ * fVar191 + auVar147._0_4_ * fVar212 + auVar4._0_4_ * fVar214;
  auVar290._4_4_ = auVar197._4_4_ * fVar218 + auVar147._4_4_ * fVar232 + auVar4._4_4_ * fVar234;
  auVar290._8_4_ = auVar197._8_4_ * fVar211 + auVar147._8_4_ * fVar213 + auVar4._8_4_ * fVar215;
  auVar290._12_4_ = auVar197._12_4_ * fVar231 + auVar147._12_4_ * fVar233 + auVar4._12_4_ * fVar236;
  local_540._0_4_ = (float)local_4f0._0_4_ + (fVar186 + auVar198._0_4_) * 0.33333334;
  local_540._4_4_ = (float)local_4f0._4_4_ + (fVar188 + auVar198._4_4_) * 0.33333334;
  fStack_538 = fStack_4e8 + (fVar190 + auVar198._8_4_) * 0.33333334;
  fStack_534 = fStack_4e4 + (fVar98 + auVar198._12_4_) * 0.33333334;
  local_3f0 = vsubps_avx(_local_540,auVar145);
  auVar4 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar147 = vmovshdup_avx(local_3f0);
  auVar197 = vmovsldup_avx(local_3f0);
  auVar308._0_4_ = auVar197._0_4_ * fVar191 + auVar147._0_4_ * fVar212 + auVar4._0_4_ * fVar214;
  auVar308._4_4_ = auVar197._4_4_ * fVar218 + auVar147._4_4_ * fVar232 + auVar4._4_4_ * fVar234;
  auVar308._8_4_ = auVar197._8_4_ * fVar211 + auVar147._8_4_ * fVar213 + auVar4._8_4_ * fVar215;
  auVar308._12_4_ = auVar197._12_4_ * fVar231 + auVar147._12_4_ * fVar233 + auVar4._12_4_ * fVar236;
  auVar241._0_4_ = (auVar220._0_4_ + auVar102._0_4_) * 0.33333334;
  auVar241._4_4_ = (auVar220._4_4_ + auVar102._4_4_) * 0.33333334;
  auVar241._8_4_ = (auVar220._8_4_ + auVar102._8_4_) * 0.33333334;
  auVar241._12_4_ = (auVar220._12_4_ + auVar102._12_4_) * 0.33333334;
  _local_430 = vsubps_avx(_local_510,auVar241);
  local_400 = vsubps_avx(_local_430,auVar145);
  auVar4 = vshufps_avx(local_400,local_400,0xaa);
  auVar147 = vmovshdup_avx(local_400);
  auVar197 = vmovsldup_avx(local_400);
  auVar242._0_4_ = auVar197._0_4_ * fVar191 + auVar147._0_4_ * fVar212 + fVar214 * auVar4._0_4_;
  auVar242._4_4_ = auVar197._4_4_ * fVar218 + auVar147._4_4_ * fVar232 + fVar234 * auVar4._4_4_;
  auVar242._8_4_ = auVar197._8_4_ * fVar211 + auVar147._8_4_ * fVar213 + fVar215 * auVar4._8_4_;
  auVar242._12_4_ = auVar197._12_4_ * fVar231 + auVar147._12_4_ * fVar233 + fVar236 * auVar4._12_4_;
  local_410 = vsubps_avx(_local_510,auVar145);
  auVar145 = vshufps_avx(local_410,local_410,0xaa);
  auVar147 = vmovshdup_avx(local_410);
  auVar197 = vmovsldup_avx(local_410);
  auVar273._0_4_ = fVar191 * auVar197._0_4_ + fVar212 * auVar147._0_4_ + fVar214 * auVar145._0_4_;
  auVar273._4_4_ = fVar218 * auVar197._4_4_ + fVar232 * auVar147._4_4_ + fVar234 * auVar145._4_4_;
  auVar273._8_4_ = fVar211 * auVar197._8_4_ + fVar213 * auVar147._8_4_ + fVar215 * auVar145._8_4_;
  auVar273._12_4_ =
       fVar231 * auVar197._12_4_ + fVar233 * auVar147._12_4_ + fVar236 * auVar145._12_4_;
  auVar4 = vmovlhps_avx(_local_690,auVar290);
  auVar298 = vmovlhps_avx(_local_620,auVar308);
  auVar5 = vmovlhps_avx(auVar318,auVar242);
  _local_4c0 = vmovlhps_avx(_local_660,auVar273);
  auVar147 = vminps_avx(auVar4,auVar298);
  auVar197 = vminps_avx(auVar5,_local_4c0);
  auVar145 = vminps_avx(auVar147,auVar197);
  auVar147 = vmaxps_avx(auVar4,auVar298);
  auVar197 = vmaxps_avx(auVar5,_local_4c0);
  auVar147 = vmaxps_avx(auVar147,auVar197);
  auVar197 = vshufpd_avx(auVar145,auVar145,3);
  auVar145 = vminps_avx(auVar145,auVar197);
  auVar197 = vshufpd_avx(auVar147,auVar147,3);
  auVar197 = vmaxps_avx(auVar147,auVar197);
  auVar221._8_4_ = 0x7fffffff;
  auVar221._0_8_ = 0x7fffffff7fffffff;
  auVar221._12_4_ = 0x7fffffff;
  auVar147 = vandps_avx(auVar145,auVar221);
  auVar197 = vandps_avx(auVar197,auVar221);
  auVar147 = vmaxps_avx(auVar147,auVar197);
  auVar197 = vmovshdup_avx(auVar147);
  auVar147 = vmaxss_avx(auVar197,auVar147);
  fVar191 = auVar147._0_4_ * 9.536743e-07;
  local_4d0 = ZEXT416((uint)fVar191);
  auVar147 = vshufps_avx(local_4d0,ZEXT416((uint)fVar191),0);
  local_1c0._16_16_ = auVar147;
  local_1c0._0_16_ = auVar147;
  auVar73._0_8_ = auVar147._0_8_ ^ 0x8000000080000000;
  auVar73._8_4_ = auVar147._8_4_ ^ 0x80000000;
  auVar73._12_4_ = auVar147._12_4_ ^ 0x80000000;
  local_360._16_16_ = auVar73;
  local_360._0_16_ = auVar73;
  auVar147 = vpshufd_avx(ZEXT416(uVar62),0);
  local_300._16_16_ = auVar147;
  local_300._0_16_ = auVar147;
  auVar147 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar68 * 4 + 6)),0);
  local_320._16_16_ = auVar147;
  local_320._0_16_ = auVar147;
  bVar71 = false;
  uVar70 = 0;
  fVar191 = *(float *)(ray + k * 4 + 0x60);
  _local_370 = vsubps_avx(auVar298,auVar4);
  _local_380 = vsubps_avx(auVar5,auVar298);
  _local_390 = vsubps_avx(_local_4c0,auVar5);
  _local_440 = vsubps_avx(_local_4f0,_local_4e0);
  _local_450 = vsubps_avx(_local_540,_local_520);
  _local_460 = vsubps_avx(_local_430,_local_530);
  _local_470 = vsubps_avx(_local_510,_local_500);
  auVar230 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar322 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_0109bd20:
  do {
    local_420 = auVar322._0_16_;
    auVar99 = auVar230._0_16_;
    auVar147 = vshufps_avx(auVar99,auVar99,0x50);
    auVar324._8_4_ = 0x3f800000;
    auVar324._0_8_ = 0x3f8000003f800000;
    auVar324._12_4_ = 0x3f800000;
    auVar328._16_4_ = 0x3f800000;
    auVar328._0_16_ = auVar324;
    auVar328._20_4_ = 0x3f800000;
    auVar328._24_4_ = 0x3f800000;
    auVar328._28_4_ = 0x3f800000;
    auVar197 = vsubps_avx(auVar324,auVar147);
    fVar218 = auVar147._0_4_;
    fVar231 = auVar147._4_4_;
    fVar232 = auVar147._8_4_;
    fVar233 = auVar147._12_4_;
    fVar211 = auVar197._0_4_;
    fVar212 = auVar197._4_4_;
    fVar213 = auVar197._8_4_;
    fVar214 = auVar197._12_4_;
    auVar159._0_4_ = auVar290._0_4_ * fVar218 + fVar187 * fVar211;
    auVar159._4_4_ = auVar290._4_4_ * fVar231 + fVar189 * fVar212;
    auVar159._8_4_ = auVar290._0_4_ * fVar232 + fVar187 * fVar213;
    auVar159._12_4_ = auVar290._4_4_ * fVar233 + fVar189 * fVar214;
    auVar131._0_4_ = auVar308._0_4_ * fVar218 + fVar216 * fVar211;
    auVar131._4_4_ = auVar308._4_4_ * fVar231 + fVar168 * fVar212;
    auVar131._8_4_ = auVar308._0_4_ * fVar232 + fVar216 * fVar213;
    auVar131._12_4_ = auVar308._4_4_ * fVar233 + fVar168 * fVar214;
    auVar243._0_4_ = auVar242._0_4_ * fVar218 + auVar318._0_4_ * fVar211;
    auVar243._4_4_ = auVar242._4_4_ * fVar231 + auVar318._4_4_ * fVar212;
    auVar243._8_4_ = auVar242._0_4_ * fVar232 + auVar318._0_4_ * fVar213;
    auVar243._12_4_ = auVar242._4_4_ * fVar233 + auVar318._4_4_ * fVar214;
    auVar170._0_4_ = auVar273._0_4_ * fVar218 + fVar237 * fVar211;
    auVar170._4_4_ = auVar273._4_4_ * fVar231 + fVar185 * fVar212;
    auVar170._8_4_ = auVar273._0_4_ * fVar232 + fVar237 * fVar213;
    auVar170._12_4_ = auVar273._4_4_ * fVar233 + fVar185 * fVar214;
    auVar147 = vmovshdup_avx(local_420);
    auVar197 = vshufps_avx(local_420,local_420,0);
    auVar280._16_16_ = auVar197;
    auVar280._0_16_ = auVar197;
    auVar145 = vshufps_avx(local_420,local_420,0x55);
    auVar91._16_16_ = auVar145;
    auVar91._0_16_ = auVar145;
    auVar87 = vsubps_avx(auVar91,auVar280);
    auVar145 = vshufps_avx(auVar159,auVar159,0);
    auVar116 = vshufps_avx(auVar159,auVar159,0x55);
    auVar105 = vshufps_avx(auVar131,auVar131,0);
    auVar135 = vshufps_avx(auVar131,auVar131,0x55);
    auVar106 = vshufps_avx(auVar243,auVar243,0);
    auVar235 = vshufps_avx(auVar243,auVar243,0x55);
    auVar6 = vshufps_avx(auVar170,auVar170,0);
    auVar72 = vshufps_avx(auVar170,auVar170,0x55);
    auVar147 = ZEXT416((uint)((auVar147._0_4_ - auVar322._0_4_) * 0.04761905));
    auVar147 = vshufps_avx(auVar147,auVar147,0);
    auVar295._0_4_ = auVar197._0_4_ + auVar87._0_4_ * 0.0;
    auVar295._4_4_ = auVar197._4_4_ + auVar87._4_4_ * 0.14285715;
    auVar295._8_4_ = auVar197._8_4_ + auVar87._8_4_ * 0.2857143;
    auVar295._12_4_ = auVar197._12_4_ + auVar87._12_4_ * 0.42857146;
    auVar295._16_4_ = auVar197._0_4_ + auVar87._16_4_ * 0.5714286;
    auVar295._20_4_ = auVar197._4_4_ + auVar87._20_4_ * 0.71428573;
    auVar295._24_4_ = auVar197._8_4_ + auVar87._24_4_ * 0.8571429;
    auVar295._28_4_ = auVar197._12_4_ + auVar87._28_4_;
    auVar16 = vsubps_avx(auVar328,auVar295);
    fVar218 = auVar105._0_4_;
    fVar231 = auVar105._4_4_;
    fVar232 = auVar105._8_4_;
    fVar233 = auVar105._12_4_;
    fVar267 = auVar16._0_4_;
    fVar282 = auVar16._4_4_;
    fVar283 = auVar16._8_4_;
    fVar284 = auVar16._12_4_;
    fVar285 = auVar16._16_4_;
    fVar286 = auVar16._20_4_;
    fVar287 = auVar16._24_4_;
    fVar263 = auVar135._0_4_;
    fVar264 = auVar135._4_4_;
    fVar265 = auVar135._8_4_;
    fVar266 = auVar135._12_4_;
    fVar323 = auVar116._12_4_ + 1.0;
    fVar217 = auVar106._0_4_;
    fVar252 = auVar106._4_4_;
    fVar253 = auVar106._8_4_;
    fVar262 = auVar106._12_4_;
    fVar234 = fVar217 * auVar295._0_4_ + fVar267 * fVar218;
    fVar215 = fVar252 * auVar295._4_4_ + fVar282 * fVar231;
    fVar236 = fVar253 * auVar295._8_4_ + fVar283 * fVar232;
    fVar186 = fVar262 * auVar295._12_4_ + fVar284 * fVar233;
    fVar188 = fVar217 * auVar295._16_4_ + fVar285 * fVar218;
    fVar190 = fVar252 * auVar295._20_4_ + fVar286 * fVar231;
    fVar98 = fVar253 * auVar295._24_4_ + fVar287 * fVar232;
    fVar211 = auVar235._0_4_;
    fVar212 = auVar235._4_4_;
    fVar213 = auVar235._8_4_;
    fVar214 = auVar235._12_4_;
    fVar306 = fVar263 * fVar267 + auVar295._0_4_ * fVar211;
    fVar311 = fVar264 * fVar282 + auVar295._4_4_ * fVar212;
    fVar312 = fVar265 * fVar283 + auVar295._8_4_ * fVar213;
    fVar313 = fVar266 * fVar284 + auVar295._12_4_ * fVar214;
    fVar314 = fVar263 * fVar285 + auVar295._16_4_ * fVar211;
    fVar315 = fVar264 * fVar286 + auVar295._20_4_ * fVar212;
    fVar316 = fVar265 * fVar287 + auVar295._24_4_ * fVar213;
    fVar317 = fVar266 + fVar233;
    auVar197 = vshufps_avx(auVar159,auVar159,0xaa);
    auVar105 = vshufps_avx(auVar159,auVar159,0xff);
    fVar167 = fVar262 + 0.0;
    auVar135 = vshufps_avx(auVar131,auVar131,0xaa);
    auVar106 = vshufps_avx(auVar131,auVar131,0xff);
    auVar183._0_4_ =
         fVar267 * (auVar295._0_4_ * fVar218 + fVar267 * auVar145._0_4_) + auVar295._0_4_ * fVar234;
    auVar183._4_4_ =
         fVar282 * (auVar295._4_4_ * fVar231 + fVar282 * auVar145._4_4_) + auVar295._4_4_ * fVar215;
    auVar183._8_4_ =
         fVar283 * (auVar295._8_4_ * fVar232 + fVar283 * auVar145._8_4_) + auVar295._8_4_ * fVar236;
    auVar183._12_4_ =
         fVar284 * (auVar295._12_4_ * fVar233 + fVar284 * auVar145._12_4_) +
         auVar295._12_4_ * fVar186;
    auVar183._16_4_ =
         fVar285 * (auVar295._16_4_ * fVar218 + fVar285 * auVar145._0_4_) +
         auVar295._16_4_ * fVar188;
    auVar183._20_4_ =
         fVar286 * (auVar295._20_4_ * fVar231 + fVar286 * auVar145._4_4_) +
         auVar295._20_4_ * fVar190;
    auVar183._24_4_ =
         fVar287 * (auVar295._24_4_ * fVar232 + fVar287 * auVar145._8_4_) + auVar295._24_4_ * fVar98
    ;
    auVar183._28_4_ = auVar145._12_4_ + 1.0 + fVar214;
    auVar209._0_4_ =
         fVar267 * (fVar263 * auVar295._0_4_ + auVar116._0_4_ * fVar267) + auVar295._0_4_ * fVar306;
    auVar209._4_4_ =
         fVar282 * (fVar264 * auVar295._4_4_ + auVar116._4_4_ * fVar282) + auVar295._4_4_ * fVar311;
    auVar209._8_4_ =
         fVar283 * (fVar265 * auVar295._8_4_ + auVar116._8_4_ * fVar283) + auVar295._8_4_ * fVar312;
    auVar209._12_4_ =
         fVar284 * (fVar266 * auVar295._12_4_ + auVar116._12_4_ * fVar284) +
         auVar295._12_4_ * fVar313;
    auVar209._16_4_ =
         fVar285 * (fVar263 * auVar295._16_4_ + auVar116._0_4_ * fVar285) +
         auVar295._16_4_ * fVar314;
    auVar209._20_4_ =
         fVar286 * (fVar264 * auVar295._20_4_ + auVar116._4_4_ * fVar286) +
         auVar295._20_4_ * fVar315;
    auVar209._24_4_ =
         fVar287 * (fVar265 * auVar295._24_4_ + auVar116._8_4_ * fVar287) +
         auVar295._24_4_ * fVar316;
    auVar209._28_4_ = auVar72._12_4_ + fVar214;
    auVar92._0_4_ =
         fVar267 * fVar234 + auVar295._0_4_ * (fVar217 * fVar267 + auVar6._0_4_ * auVar295._0_4_);
    auVar92._4_4_ =
         fVar282 * fVar215 + auVar295._4_4_ * (fVar252 * fVar282 + auVar6._4_4_ * auVar295._4_4_);
    auVar92._8_4_ =
         fVar283 * fVar236 + auVar295._8_4_ * (fVar253 * fVar283 + auVar6._8_4_ * auVar295._8_4_);
    auVar92._12_4_ =
         fVar284 * fVar186 + auVar295._12_4_ * (fVar262 * fVar284 + auVar6._12_4_ * auVar295._12_4_)
    ;
    auVar92._16_4_ =
         fVar285 * fVar188 + auVar295._16_4_ * (fVar217 * fVar285 + auVar6._0_4_ * auVar295._16_4_);
    auVar92._20_4_ =
         fVar286 * fVar190 + auVar295._20_4_ * (fVar252 * fVar286 + auVar6._4_4_ * auVar295._20_4_);
    auVar92._24_4_ =
         fVar287 * fVar98 + auVar295._24_4_ * (fVar253 * fVar287 + auVar6._8_4_ * auVar295._24_4_);
    auVar92._28_4_ = fVar233 + 1.0 + fVar167;
    auVar305._0_4_ =
         fVar267 * fVar306 + auVar295._0_4_ * (auVar72._0_4_ * auVar295._0_4_ + fVar267 * fVar211);
    auVar305._4_4_ =
         fVar282 * fVar311 + auVar295._4_4_ * (auVar72._4_4_ * auVar295._4_4_ + fVar282 * fVar212);
    auVar305._8_4_ =
         fVar283 * fVar312 + auVar295._8_4_ * (auVar72._8_4_ * auVar295._8_4_ + fVar283 * fVar213);
    auVar305._12_4_ =
         fVar284 * fVar313 +
         auVar295._12_4_ * (auVar72._12_4_ * auVar295._12_4_ + fVar284 * fVar214);
    auVar305._16_4_ =
         fVar285 * fVar314 + auVar295._16_4_ * (auVar72._0_4_ * auVar295._16_4_ + fVar285 * fVar211)
    ;
    auVar305._20_4_ =
         fVar286 * fVar315 + auVar295._20_4_ * (auVar72._4_4_ * auVar295._20_4_ + fVar286 * fVar212)
    ;
    auVar305._24_4_ =
         fVar287 * fVar316 + auVar295._24_4_ * (auVar72._8_4_ * auVar295._24_4_ + fVar287 * fVar213)
    ;
    auVar305._28_4_ = fVar167 + fVar214 + 0.0;
    local_200._0_4_ = fVar267 * auVar183._0_4_ + auVar295._0_4_ * auVar92._0_4_;
    local_200._4_4_ = fVar282 * auVar183._4_4_ + auVar295._4_4_ * auVar92._4_4_;
    local_200._8_4_ = fVar283 * auVar183._8_4_ + auVar295._8_4_ * auVar92._8_4_;
    local_200._12_4_ = fVar284 * auVar183._12_4_ + auVar295._12_4_ * auVar92._12_4_;
    local_200._16_4_ = fVar285 * auVar183._16_4_ + auVar295._16_4_ * auVar92._16_4_;
    local_200._20_4_ = fVar286 * auVar183._20_4_ + auVar295._20_4_ * auVar92._20_4_;
    local_200._24_4_ = fVar287 * auVar183._24_4_ + auVar295._24_4_ * auVar92._24_4_;
    local_200._28_4_ = fVar317 + fVar214 + 0.0;
    auVar166._0_4_ = fVar267 * auVar209._0_4_ + auVar295._0_4_ * auVar305._0_4_;
    auVar166._4_4_ = fVar282 * auVar209._4_4_ + auVar295._4_4_ * auVar305._4_4_;
    auVar166._8_4_ = fVar283 * auVar209._8_4_ + auVar295._8_4_ * auVar305._8_4_;
    auVar166._12_4_ = fVar284 * auVar209._12_4_ + auVar295._12_4_ * auVar305._12_4_;
    auVar166._16_4_ = fVar285 * auVar209._16_4_ + auVar295._16_4_ * auVar305._16_4_;
    auVar166._20_4_ = fVar286 * auVar209._20_4_ + auVar295._20_4_ * auVar305._20_4_;
    auVar166._24_4_ = fVar287 * auVar209._24_4_ + auVar295._24_4_ * auVar305._24_4_;
    auVar166._28_4_ = fVar317 + fVar167;
    auVar17 = vsubps_avx(auVar92,auVar183);
    auVar87 = vsubps_avx(auVar305,auVar209);
    local_5e0 = auVar147._0_4_;
    fStack_5dc = auVar147._4_4_;
    fStack_5d8 = auVar147._8_4_;
    fStack_5d4 = auVar147._12_4_;
    local_240 = local_5e0 * auVar17._0_4_ * 3.0;
    fStack_23c = fStack_5dc * auVar17._4_4_ * 3.0;
    auVar24._4_4_ = fStack_23c;
    auVar24._0_4_ = local_240;
    fStack_238 = fStack_5d8 * auVar17._8_4_ * 3.0;
    auVar24._8_4_ = fStack_238;
    fStack_234 = fStack_5d4 * auVar17._12_4_ * 3.0;
    auVar24._12_4_ = fStack_234;
    fStack_230 = local_5e0 * auVar17._16_4_ * 3.0;
    auVar24._16_4_ = fStack_230;
    fStack_22c = fStack_5dc * auVar17._20_4_ * 3.0;
    auVar24._20_4_ = fStack_22c;
    fStack_228 = fStack_5d8 * auVar17._24_4_ * 3.0;
    auVar24._24_4_ = fStack_228;
    auVar24._28_4_ = auVar17._28_4_;
    local_260 = local_5e0 * auVar87._0_4_ * 3.0;
    fStack_25c = fStack_5dc * auVar87._4_4_ * 3.0;
    auVar25._4_4_ = fStack_25c;
    auVar25._0_4_ = local_260;
    fStack_258 = fStack_5d8 * auVar87._8_4_ * 3.0;
    auVar25._8_4_ = fStack_258;
    fStack_254 = fStack_5d4 * auVar87._12_4_ * 3.0;
    auVar25._12_4_ = fStack_254;
    fStack_250 = local_5e0 * auVar87._16_4_ * 3.0;
    auVar25._16_4_ = fStack_250;
    fStack_24c = fStack_5dc * auVar87._20_4_ * 3.0;
    auVar25._20_4_ = fStack_24c;
    fStack_248 = fStack_5d8 * auVar87._24_4_ * 3.0;
    auVar25._24_4_ = fStack_248;
    auVar25._28_4_ = fVar317;
    auVar14 = vsubps_avx(local_200,auVar24);
    auVar87 = vperm2f128_avx(auVar14,auVar14,1);
    auVar87 = vshufps_avx(auVar87,auVar14,0x30);
    auVar87 = vshufps_avx(auVar14,auVar87,0x29);
    auVar15 = vsubps_avx(auVar166,auVar25);
    auVar14 = vperm2f128_avx(auVar15,auVar15,1);
    auVar14 = vshufps_avx(auVar14,auVar15,0x30);
    auVar15 = vshufps_avx(auVar15,auVar14,0x29);
    fVar315 = auVar135._0_4_;
    fVar316 = auVar135._4_4_;
    fVar330 = auVar135._8_4_;
    fVar233 = auVar197._12_4_;
    fVar252 = auVar106._0_4_;
    fVar262 = auVar106._4_4_;
    fVar306 = auVar106._8_4_;
    fVar311 = auVar106._12_4_;
    auVar147 = vshufps_avx(auVar243,auVar243,0xaa);
    fVar218 = auVar147._0_4_;
    fVar231 = auVar147._4_4_;
    fVar232 = auVar147._8_4_;
    fVar214 = auVar147._12_4_;
    fVar236 = auVar295._0_4_ * fVar218 + fVar315 * fVar267;
    fVar186 = auVar295._4_4_ * fVar231 + fVar316 * fVar282;
    fVar188 = auVar295._8_4_ * fVar232 + fVar330 * fVar283;
    fVar190 = auVar295._12_4_ * fVar214 + auVar135._12_4_ * fVar284;
    fVar98 = auVar295._16_4_ * fVar218 + fVar315 * fVar285;
    fVar167 = auVar295._20_4_ * fVar231 + fVar316 * fVar286;
    fVar217 = auVar295._24_4_ * fVar232 + fVar330 * fVar287;
    auVar147 = vshufps_avx(auVar243,auVar243,0xff);
    fVar211 = auVar147._0_4_;
    fVar212 = auVar147._4_4_;
    fVar213 = auVar147._8_4_;
    fVar234 = auVar147._12_4_;
    fVar253 = auVar295._0_4_ * fVar211 + fVar252 * fVar267;
    fVar263 = auVar295._4_4_ * fVar212 + fVar262 * fVar282;
    fVar264 = auVar295._8_4_ * fVar213 + fVar306 * fVar283;
    fVar265 = auVar295._12_4_ * fVar234 + fVar311 * fVar284;
    fVar312 = auVar295._16_4_ * fVar211 + fVar252 * fVar285;
    fVar266 = auVar295._20_4_ * fVar212 + fVar262 * fVar286;
    fVar313 = auVar295._24_4_ * fVar213 + fVar306 * fVar287;
    auVar147 = vshufps_avx(auVar170,auVar170,0xaa);
    fVar314 = auVar147._12_4_ + fVar214;
    auVar145 = vshufps_avx(auVar170,auVar170,0xff);
    fVar215 = auVar145._12_4_;
    auVar93._0_4_ =
         fVar267 * (fVar315 * auVar295._0_4_ + fVar267 * auVar197._0_4_) + auVar295._0_4_ * fVar236;
    auVar93._4_4_ =
         fVar282 * (fVar316 * auVar295._4_4_ + fVar282 * auVar197._4_4_) + auVar295._4_4_ * fVar186;
    auVar93._8_4_ =
         fVar283 * (fVar330 * auVar295._8_4_ + fVar283 * auVar197._8_4_) + auVar295._8_4_ * fVar188;
    auVar93._12_4_ =
         fVar284 * (auVar135._12_4_ * auVar295._12_4_ + fVar284 * fVar233) +
         auVar295._12_4_ * fVar190;
    auVar93._16_4_ =
         fVar285 * (fVar315 * auVar295._16_4_ + fVar285 * auVar197._0_4_) + auVar295._16_4_ * fVar98
    ;
    auVar93._20_4_ =
         fVar286 * (fVar316 * auVar295._20_4_ + fVar286 * auVar197._4_4_) +
         auVar295._20_4_ * fVar167;
    auVar93._24_4_ =
         fVar287 * (fVar330 * auVar295._24_4_ + fVar287 * auVar197._8_4_) +
         auVar295._24_4_ * fVar217;
    auVar93._28_4_ = auVar15._28_4_ + fVar233 + fVar215;
    auVar125._0_4_ =
         fVar267 * (fVar252 * auVar295._0_4_ + auVar105._0_4_ * fVar267) + auVar295._0_4_ * fVar253;
    auVar125._4_4_ =
         fVar282 * (fVar262 * auVar295._4_4_ + auVar105._4_4_ * fVar282) + auVar295._4_4_ * fVar263;
    auVar125._8_4_ =
         fVar283 * (fVar306 * auVar295._8_4_ + auVar105._8_4_ * fVar283) + auVar295._8_4_ * fVar264;
    auVar125._12_4_ =
         fVar284 * (fVar311 * auVar295._12_4_ + auVar105._12_4_ * fVar284) +
         auVar295._12_4_ * fVar265;
    auVar125._16_4_ =
         fVar285 * (fVar252 * auVar295._16_4_ + auVar105._0_4_ * fVar285) +
         auVar295._16_4_ * fVar312;
    auVar125._20_4_ =
         fVar286 * (fVar262 * auVar295._20_4_ + auVar105._4_4_ * fVar286) +
         auVar295._20_4_ * fVar266;
    auVar125._24_4_ =
         fVar287 * (fVar306 * auVar295._24_4_ + auVar105._8_4_ * fVar287) +
         auVar295._24_4_ * fVar313;
    auVar125._28_4_ = fVar233 + auVar14._28_4_ + fVar215;
    auVar14 = vperm2f128_avx(local_200,local_200,1);
    auVar14 = vshufps_avx(auVar14,local_200,0x30);
    _local_560 = vshufps_avx(local_200,auVar14,0x29);
    auVar210._0_4_ =
         auVar295._0_4_ * (auVar147._0_4_ * auVar295._0_4_ + fVar267 * fVar218) + fVar267 * fVar236;
    auVar210._4_4_ =
         auVar295._4_4_ * (auVar147._4_4_ * auVar295._4_4_ + fVar282 * fVar231) + fVar282 * fVar186;
    auVar210._8_4_ =
         auVar295._8_4_ * (auVar147._8_4_ * auVar295._8_4_ + fVar283 * fVar232) + fVar283 * fVar188;
    auVar210._12_4_ =
         auVar295._12_4_ * (auVar147._12_4_ * auVar295._12_4_ + fVar284 * fVar214) +
         fVar284 * fVar190;
    auVar210._16_4_ =
         auVar295._16_4_ * (auVar147._0_4_ * auVar295._16_4_ + fVar285 * fVar218) + fVar285 * fVar98
    ;
    auVar210._20_4_ =
         auVar295._20_4_ * (auVar147._4_4_ * auVar295._20_4_ + fVar286 * fVar231) +
         fVar286 * fVar167;
    auVar210._24_4_ =
         auVar295._24_4_ * (auVar147._8_4_ * auVar295._24_4_ + fVar287 * fVar232) +
         fVar287 * fVar217;
    auVar210._28_4_ = fVar314 + fVar323 + auVar209._28_4_;
    auVar261._0_4_ =
         fVar267 * fVar253 + auVar295._0_4_ * (auVar295._0_4_ * auVar145._0_4_ + fVar267 * fVar211);
    auVar261._4_4_ =
         fVar282 * fVar263 + auVar295._4_4_ * (auVar295._4_4_ * auVar145._4_4_ + fVar282 * fVar212);
    auVar261._8_4_ =
         fVar283 * fVar264 + auVar295._8_4_ * (auVar295._8_4_ * auVar145._8_4_ + fVar283 * fVar213);
    auVar261._12_4_ =
         fVar284 * fVar265 + auVar295._12_4_ * (auVar295._12_4_ * fVar215 + fVar284 * fVar234);
    auVar261._16_4_ =
         fVar285 * fVar312 +
         auVar295._16_4_ * (auVar295._16_4_ * auVar145._0_4_ + fVar285 * fVar211);
    auVar261._20_4_ =
         fVar286 * fVar266 +
         auVar295._20_4_ * (auVar295._20_4_ * auVar145._4_4_ + fVar286 * fVar212);
    auVar261._24_4_ =
         fVar287 * fVar313 +
         auVar295._24_4_ * (auVar295._24_4_ * auVar145._8_4_ + fVar287 * fVar213);
    auVar261._28_4_ = fVar323 + fVar311 + fVar215 + fVar234;
    auVar251._0_4_ = fVar267 * auVar93._0_4_ + auVar295._0_4_ * auVar210._0_4_;
    auVar251._4_4_ = fVar282 * auVar93._4_4_ + auVar295._4_4_ * auVar210._4_4_;
    auVar251._8_4_ = fVar283 * auVar93._8_4_ + auVar295._8_4_ * auVar210._8_4_;
    auVar251._12_4_ = fVar284 * auVar93._12_4_ + auVar295._12_4_ * auVar210._12_4_;
    auVar251._16_4_ = fVar285 * auVar93._16_4_ + auVar295._16_4_ * auVar210._16_4_;
    auVar251._20_4_ = fVar286 * auVar93._20_4_ + auVar295._20_4_ * auVar210._20_4_;
    auVar251._24_4_ = fVar287 * auVar93._24_4_ + auVar295._24_4_ * auVar210._24_4_;
    auVar251._28_4_ = fVar314 + fVar215 + fVar234;
    auVar281._0_4_ = fVar267 * auVar125._0_4_ + auVar295._0_4_ * auVar261._0_4_;
    auVar281._4_4_ = fVar282 * auVar125._4_4_ + auVar295._4_4_ * auVar261._4_4_;
    auVar281._8_4_ = fVar283 * auVar125._8_4_ + auVar295._8_4_ * auVar261._8_4_;
    auVar281._12_4_ = fVar284 * auVar125._12_4_ + auVar295._12_4_ * auVar261._12_4_;
    auVar281._16_4_ = fVar285 * auVar125._16_4_ + auVar295._16_4_ * auVar261._16_4_;
    auVar281._20_4_ = fVar286 * auVar125._20_4_ + auVar295._20_4_ * auVar261._20_4_;
    auVar281._24_4_ = fVar287 * auVar125._24_4_ + auVar295._24_4_ * auVar261._24_4_;
    auVar281._28_4_ = auVar16._28_4_ + auVar295._28_4_;
    auVar20 = vsubps_avx(auVar210,auVar93);
    auVar14 = vsubps_avx(auVar261,auVar125);
    local_280 = local_5e0 * auVar20._0_4_ * 3.0;
    fStack_27c = fStack_5dc * auVar20._4_4_ * 3.0;
    auVar26._4_4_ = fStack_27c;
    auVar26._0_4_ = local_280;
    fStack_278 = fStack_5d8 * auVar20._8_4_ * 3.0;
    auVar26._8_4_ = fStack_278;
    fStack_274 = fStack_5d4 * auVar20._12_4_ * 3.0;
    auVar26._12_4_ = fStack_274;
    fStack_270 = local_5e0 * auVar20._16_4_ * 3.0;
    auVar26._16_4_ = fStack_270;
    fStack_26c = fStack_5dc * auVar20._20_4_ * 3.0;
    auVar26._20_4_ = fStack_26c;
    fStack_268 = fStack_5d8 * auVar20._24_4_ * 3.0;
    auVar26._24_4_ = fStack_268;
    auVar26._28_4_ = auVar20._28_4_;
    local_2a0 = local_5e0 * auVar14._0_4_ * 3.0;
    fStack_29c = fStack_5dc * auVar14._4_4_ * 3.0;
    auVar27._4_4_ = fStack_29c;
    auVar27._0_4_ = local_2a0;
    fStack_298 = fStack_5d8 * auVar14._8_4_ * 3.0;
    auVar27._8_4_ = fStack_298;
    fStack_294 = fStack_5d4 * auVar14._12_4_ * 3.0;
    auVar27._12_4_ = fStack_294;
    fStack_290 = local_5e0 * auVar14._16_4_ * 3.0;
    auVar27._16_4_ = fStack_290;
    fStack_28c = fStack_5dc * auVar14._20_4_ * 3.0;
    auVar27._20_4_ = fStack_28c;
    fStack_288 = fStack_5d8 * auVar14._24_4_ * 3.0;
    auVar27._24_4_ = fStack_288;
    auVar27._28_4_ = auVar210._28_4_;
    auVar14 = vperm2f128_avx(auVar251,auVar251,1);
    auVar14 = vshufps_avx(auVar14,auVar251,0x30);
    auVar18 = vshufps_avx(auVar251,auVar14,0x29);
    auVar16 = vsubps_avx(auVar251,auVar26);
    auVar14 = vperm2f128_avx(auVar16,auVar16,1);
    auVar14 = vshufps_avx(auVar14,auVar16,0x30);
    auVar14 = vshufps_avx(auVar16,auVar14,0x29);
    auVar19 = vsubps_avx(auVar281,auVar27);
    auVar16 = vperm2f128_avx(auVar19,auVar19,1);
    auVar16 = vshufps_avx(auVar16,auVar19,0x30);
    auVar19 = vshufps_avx(auVar19,auVar16,0x29);
    auVar21 = vsubps_avx(auVar251,local_200);
    auVar22 = vsubps_avx(auVar18,_local_560);
    fVar218 = auVar22._0_4_ + auVar21._0_4_;
    fVar211 = auVar22._4_4_ + auVar21._4_4_;
    fVar231 = auVar22._8_4_ + auVar21._8_4_;
    fVar212 = auVar22._12_4_ + auVar21._12_4_;
    fVar232 = auVar22._16_4_ + auVar21._16_4_;
    fVar213 = auVar22._20_4_ + auVar21._20_4_;
    fVar233 = auVar22._24_4_ + auVar21._24_4_;
    auVar16 = vperm2f128_avx(auVar166,auVar166,1);
    auVar16 = vshufps_avx(auVar16,auVar166,0x30);
    local_220 = vshufps_avx(auVar166,auVar16,0x29);
    auVar16 = vperm2f128_avx(auVar281,auVar281,1);
    auVar16 = vshufps_avx(auVar16,auVar281,0x30);
    local_1e0 = vshufps_avx(auVar281,auVar16,0x29);
    auVar16 = vsubps_avx(auVar281,auVar166);
    auVar23 = vsubps_avx(local_1e0,local_220);
    fVar214 = auVar23._0_4_ + auVar16._0_4_;
    fVar234 = auVar23._4_4_ + auVar16._4_4_;
    fVar215 = auVar23._8_4_ + auVar16._8_4_;
    fVar236 = auVar23._12_4_ + auVar16._12_4_;
    fVar186 = auVar23._16_4_ + auVar16._16_4_;
    fVar188 = auVar23._20_4_ + auVar16._20_4_;
    fVar190 = auVar23._24_4_ + auVar16._24_4_;
    auVar28._4_4_ = fVar211 * auVar166._4_4_;
    auVar28._0_4_ = fVar218 * auVar166._0_4_;
    auVar28._8_4_ = fVar231 * auVar166._8_4_;
    auVar28._12_4_ = fVar212 * auVar166._12_4_;
    auVar28._16_4_ = fVar232 * auVar166._16_4_;
    auVar28._20_4_ = fVar213 * auVar166._20_4_;
    auVar28._24_4_ = fVar233 * auVar166._24_4_;
    auVar28._28_4_ = auVar16._28_4_;
    auVar29._4_4_ = fVar234 * local_200._4_4_;
    auVar29._0_4_ = fVar214 * local_200._0_4_;
    auVar29._8_4_ = fVar215 * local_200._8_4_;
    auVar29._12_4_ = fVar236 * local_200._12_4_;
    auVar29._16_4_ = fVar186 * local_200._16_4_;
    auVar29._20_4_ = fVar188 * local_200._20_4_;
    auVar29._24_4_ = fVar190 * local_200._24_4_;
    auVar29._28_4_ = fVar314;
    auVar88 = vsubps_avx(auVar28,auVar29);
    local_240 = local_200._0_4_ + local_240;
    fStack_23c = local_200._4_4_ + fStack_23c;
    fStack_238 = local_200._8_4_ + fStack_238;
    fStack_234 = local_200._12_4_ + fStack_234;
    fStack_230 = local_200._16_4_ + fStack_230;
    fStack_22c = local_200._20_4_ + fStack_22c;
    fStack_228 = local_200._24_4_ + fStack_228;
    fStack_224 = local_200._28_4_ + auVar17._28_4_;
    local_260 = local_260 + auVar166._0_4_;
    fStack_25c = fStack_25c + auVar166._4_4_;
    fStack_258 = fStack_258 + auVar166._8_4_;
    fStack_254 = fStack_254 + auVar166._12_4_;
    fStack_250 = fStack_250 + auVar166._16_4_;
    fStack_24c = fStack_24c + auVar166._20_4_;
    fStack_248 = fStack_248 + auVar166._24_4_;
    fStack_244 = fVar317 + auVar166._28_4_;
    auVar30._4_4_ = fVar211 * fStack_25c;
    auVar30._0_4_ = fVar218 * local_260;
    auVar30._8_4_ = fVar231 * fStack_258;
    auVar30._12_4_ = fVar212 * fStack_254;
    auVar30._16_4_ = fVar232 * fStack_250;
    auVar30._20_4_ = fVar213 * fStack_24c;
    auVar30._24_4_ = fVar233 * fStack_248;
    auVar30._28_4_ = fVar317;
    auVar31._4_4_ = fVar234 * fStack_23c;
    auVar31._0_4_ = fVar214 * local_240;
    auVar31._8_4_ = fVar215 * fStack_238;
    auVar31._12_4_ = fVar236 * fStack_234;
    auVar31._16_4_ = fVar186 * fStack_230;
    auVar31._20_4_ = fVar188 * fStack_22c;
    auVar31._24_4_ = fVar190 * fStack_228;
    auVar31._28_4_ = fVar317 + auVar166._28_4_;
    auVar17 = vsubps_avx(auVar30,auVar31);
    local_620._0_4_ = auVar15._0_4_;
    local_620._4_4_ = auVar15._4_4_;
    fStack_618 = auVar15._8_4_;
    fStack_614 = auVar15._12_4_;
    fStack_610 = auVar15._16_4_;
    fStack_60c = auVar15._20_4_;
    fStack_608 = auVar15._24_4_;
    auVar32._4_4_ = fVar211 * (float)local_620._4_4_;
    auVar32._0_4_ = fVar218 * (float)local_620._0_4_;
    auVar32._8_4_ = fVar231 * fStack_618;
    auVar32._12_4_ = fVar212 * fStack_614;
    auVar32._16_4_ = fVar232 * fStack_610;
    auVar32._20_4_ = fVar213 * fStack_60c;
    auVar32._24_4_ = fVar233 * fStack_608;
    auVar32._28_4_ = fVar317;
    local_680._0_4_ = auVar87._0_4_;
    local_680._4_4_ = auVar87._4_4_;
    fStack_678 = auVar87._8_4_;
    fStack_674 = auVar87._12_4_;
    fStack_670 = auVar87._16_4_;
    fStack_66c = auVar87._20_4_;
    fStack_668 = auVar87._24_4_;
    auVar33._4_4_ = fVar234 * (float)local_680._4_4_;
    auVar33._0_4_ = fVar214 * (float)local_680._0_4_;
    auVar33._8_4_ = fVar215 * fStack_678;
    auVar33._12_4_ = fVar236 * fStack_674;
    auVar33._16_4_ = fVar186 * fStack_670;
    auVar33._20_4_ = fVar188 * fStack_66c;
    auVar33._24_4_ = fVar190 * fStack_668;
    auVar33._28_4_ = local_200._28_4_;
    auVar89 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = local_220._4_4_ * fVar211;
    auVar34._0_4_ = local_220._0_4_ * fVar218;
    auVar34._8_4_ = local_220._8_4_ * fVar231;
    auVar34._12_4_ = local_220._12_4_ * fVar212;
    auVar34._16_4_ = local_220._16_4_ * fVar232;
    auVar34._20_4_ = local_220._20_4_ * fVar213;
    auVar34._24_4_ = local_220._24_4_ * fVar233;
    auVar34._28_4_ = fVar317;
    auVar35._4_4_ = local_560._4_4_ * fVar234;
    auVar35._0_4_ = local_560._0_4_ * fVar214;
    auVar35._8_4_ = local_560._8_4_ * fVar215;
    auVar35._12_4_ = local_560._12_4_ * fVar236;
    auVar35._16_4_ = local_560._16_4_ * fVar186;
    auVar35._20_4_ = local_560._20_4_ * fVar188;
    auVar35._24_4_ = local_560._24_4_ * fVar190;
    auVar35._28_4_ = local_220._28_4_;
    local_5e0 = auVar14._0_4_;
    fStack_5dc = auVar14._4_4_;
    fStack_5d8 = auVar14._8_4_;
    fStack_5d4 = auVar14._12_4_;
    fStack_5d0 = auVar14._16_4_;
    fStack_5cc = auVar14._20_4_;
    fStack_5c8 = auVar14._24_4_;
    auVar121 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar281._4_4_ * fVar211;
    auVar36._0_4_ = auVar281._0_4_ * fVar218;
    auVar36._8_4_ = auVar281._8_4_ * fVar231;
    auVar36._12_4_ = auVar281._12_4_ * fVar212;
    auVar36._16_4_ = auVar281._16_4_ * fVar232;
    auVar36._20_4_ = auVar281._20_4_ * fVar213;
    auVar36._24_4_ = auVar281._24_4_ * fVar233;
    auVar36._28_4_ = fVar317;
    auVar37._4_4_ = fVar234 * auVar251._4_4_;
    auVar37._0_4_ = fVar214 * auVar251._0_4_;
    auVar37._8_4_ = fVar215 * auVar251._8_4_;
    auVar37._12_4_ = fVar236 * auVar251._12_4_;
    auVar37._16_4_ = fVar186 * auVar251._16_4_;
    auVar37._20_4_ = fVar188 * auVar251._20_4_;
    auVar37._24_4_ = fVar190 * auVar251._24_4_;
    auVar37._28_4_ = fStack_224;
    auVar122 = vsubps_avx(auVar36,auVar37);
    local_280 = auVar251._0_4_ + local_280;
    fStack_27c = auVar251._4_4_ + fStack_27c;
    fStack_278 = auVar251._8_4_ + fStack_278;
    fStack_274 = auVar251._12_4_ + fStack_274;
    fStack_270 = auVar251._16_4_ + fStack_270;
    fStack_26c = auVar251._20_4_ + fStack_26c;
    fStack_268 = auVar251._24_4_ + fStack_268;
    fStack_264 = auVar251._28_4_ + auVar20._28_4_;
    local_2a0 = auVar281._0_4_ + local_2a0;
    fStack_29c = auVar281._4_4_ + fStack_29c;
    fStack_298 = auVar281._8_4_ + fStack_298;
    fStack_294 = auVar281._12_4_ + fStack_294;
    fStack_290 = auVar281._16_4_ + fStack_290;
    fStack_28c = auVar281._20_4_ + fStack_28c;
    fStack_288 = auVar281._24_4_ + fStack_288;
    fStack_284 = auVar281._28_4_ + auVar210._28_4_;
    auVar38._4_4_ = fVar211 * fStack_29c;
    auVar38._0_4_ = fVar218 * local_2a0;
    auVar38._8_4_ = fVar231 * fStack_298;
    auVar38._12_4_ = fVar212 * fStack_294;
    auVar38._16_4_ = fVar232 * fStack_290;
    auVar38._20_4_ = fVar213 * fStack_28c;
    auVar38._24_4_ = fVar233 * fStack_288;
    auVar38._28_4_ = auVar281._28_4_ + auVar210._28_4_;
    auVar39._4_4_ = fStack_27c * fVar234;
    auVar39._0_4_ = local_280 * fVar214;
    auVar39._8_4_ = fStack_278 * fVar215;
    auVar39._12_4_ = fStack_274 * fVar236;
    auVar39._16_4_ = fStack_270 * fVar186;
    auVar39._20_4_ = fStack_26c * fVar188;
    auVar39._24_4_ = fStack_268 * fVar190;
    auVar39._28_4_ = fStack_264;
    auVar20 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = fVar211 * auVar19._4_4_;
    auVar40._0_4_ = fVar218 * auVar19._0_4_;
    auVar40._8_4_ = fVar231 * auVar19._8_4_;
    auVar40._12_4_ = fVar212 * auVar19._12_4_;
    auVar40._16_4_ = fVar232 * auVar19._16_4_;
    auVar40._20_4_ = fVar213 * auVar19._20_4_;
    auVar40._24_4_ = fVar233 * auVar19._24_4_;
    auVar40._28_4_ = fStack_264;
    auVar41._4_4_ = fVar234 * fStack_5dc;
    auVar41._0_4_ = fVar214 * local_5e0;
    auVar41._8_4_ = fVar215 * fStack_5d8;
    auVar41._12_4_ = fVar236 * fStack_5d4;
    auVar41._16_4_ = fVar186 * fStack_5d0;
    auVar41._20_4_ = fVar188 * fStack_5cc;
    auVar41._24_4_ = fVar190 * fStack_5c8;
    auVar41._28_4_ = auVar19._28_4_;
    auVar123 = vsubps_avx(auVar40,auVar41);
    auVar42._4_4_ = fVar211 * local_1e0._4_4_;
    auVar42._0_4_ = fVar218 * local_1e0._0_4_;
    auVar42._8_4_ = fVar231 * local_1e0._8_4_;
    auVar42._12_4_ = fVar212 * local_1e0._12_4_;
    auVar42._16_4_ = fVar232 * local_1e0._16_4_;
    auVar42._20_4_ = fVar213 * local_1e0._20_4_;
    auVar42._24_4_ = fVar233 * local_1e0._24_4_;
    auVar42._28_4_ = auVar22._28_4_ + auVar21._28_4_;
    auVar43._4_4_ = auVar18._4_4_ * fVar234;
    auVar43._0_4_ = auVar18._0_4_ * fVar214;
    auVar43._8_4_ = auVar18._8_4_ * fVar215;
    auVar43._12_4_ = auVar18._12_4_ * fVar236;
    auVar43._16_4_ = auVar18._16_4_ * fVar186;
    auVar43._20_4_ = auVar18._20_4_ * fVar188;
    auVar43._24_4_ = auVar18._24_4_ * fVar190;
    auVar43._28_4_ = auVar23._28_4_ + auVar16._28_4_;
    auVar21 = vsubps_avx(auVar42,auVar43);
    auVar14 = vminps_avx(auVar88,auVar17);
    auVar87 = vmaxps_avx(auVar88,auVar17);
    auVar15 = vminps_avx(auVar89,auVar121);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar89,auVar121);
    auVar87 = vmaxps_avx(auVar87,auVar14);
    auVar16 = vminps_avx(auVar122,auVar20);
    auVar14 = vmaxps_avx(auVar122,auVar20);
    auVar17 = vminps_avx(auVar123,auVar21);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar17 = vminps_avx(auVar15,auVar17);
    auVar15 = vmaxps_avx(auVar123,auVar21);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar87,auVar14);
    auVar87 = vcmpps_avx(auVar17,local_1c0,2);
    auVar14 = vcmpps_avx(auVar14,local_360,5);
    auVar87 = vandps_avx(auVar14,auVar87);
    auVar14 = local_2c0 & auVar87;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(_local_560,local_200);
      auVar15 = vsubps_avx(auVar18,auVar251);
      fVar211 = auVar14._0_4_ + auVar15._0_4_;
      fVar231 = auVar14._4_4_ + auVar15._4_4_;
      fVar212 = auVar14._8_4_ + auVar15._8_4_;
      fVar232 = auVar14._12_4_ + auVar15._12_4_;
      fVar213 = auVar14._16_4_ + auVar15._16_4_;
      fVar233 = auVar14._20_4_ + auVar15._20_4_;
      fVar214 = auVar14._24_4_ + auVar15._24_4_;
      auVar17 = vsubps_avx(local_220,auVar166);
      auVar20 = vsubps_avx(local_1e0,auVar281);
      fVar234 = auVar17._0_4_ + auVar20._0_4_;
      fVar215 = auVar17._4_4_ + auVar20._4_4_;
      fVar236 = auVar17._8_4_ + auVar20._8_4_;
      fVar186 = auVar17._12_4_ + auVar20._12_4_;
      fVar188 = auVar17._16_4_ + auVar20._16_4_;
      fVar190 = auVar17._20_4_ + auVar20._20_4_;
      fVar98 = auVar17._24_4_ + auVar20._24_4_;
      fVar218 = auVar20._28_4_;
      auVar44._4_4_ = auVar166._4_4_ * fVar231;
      auVar44._0_4_ = auVar166._0_4_ * fVar211;
      auVar44._8_4_ = auVar166._8_4_ * fVar212;
      auVar44._12_4_ = auVar166._12_4_ * fVar232;
      auVar44._16_4_ = auVar166._16_4_ * fVar213;
      auVar44._20_4_ = auVar166._20_4_ * fVar233;
      auVar44._24_4_ = auVar166._24_4_ * fVar214;
      auVar44._28_4_ = auVar166._28_4_;
      auVar45._4_4_ = local_200._4_4_ * fVar215;
      auVar45._0_4_ = local_200._0_4_ * fVar234;
      auVar45._8_4_ = local_200._8_4_ * fVar236;
      auVar45._12_4_ = local_200._12_4_ * fVar186;
      auVar45._16_4_ = local_200._16_4_ * fVar188;
      auVar45._20_4_ = local_200._20_4_ * fVar190;
      auVar45._24_4_ = local_200._24_4_ * fVar98;
      auVar45._28_4_ = local_200._28_4_;
      auVar20 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar231 * fStack_25c;
      auVar46._0_4_ = fVar211 * local_260;
      auVar46._8_4_ = fVar212 * fStack_258;
      auVar46._12_4_ = fVar232 * fStack_254;
      auVar46._16_4_ = fVar213 * fStack_250;
      auVar46._20_4_ = fVar233 * fStack_24c;
      auVar46._24_4_ = fVar214 * fStack_248;
      auVar46._28_4_ = auVar166._28_4_;
      auVar47._4_4_ = fVar215 * fStack_23c;
      auVar47._0_4_ = fVar234 * local_240;
      auVar47._8_4_ = fVar236 * fStack_238;
      auVar47._12_4_ = fVar186 * fStack_234;
      auVar47._16_4_ = fVar188 * fStack_230;
      auVar47._20_4_ = fVar190 * fStack_22c;
      auVar47._24_4_ = fVar98 * fStack_228;
      auVar47._28_4_ = fVar218;
      auVar21 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar231 * (float)local_620._4_4_;
      auVar48._0_4_ = fVar211 * (float)local_620._0_4_;
      auVar48._8_4_ = fVar212 * fStack_618;
      auVar48._12_4_ = fVar232 * fStack_614;
      auVar48._16_4_ = fVar213 * fStack_610;
      auVar48._20_4_ = fVar233 * fStack_60c;
      auVar48._24_4_ = fVar214 * fStack_608;
      auVar48._28_4_ = fVar218;
      auVar49._4_4_ = fVar215 * (float)local_680._4_4_;
      auVar49._0_4_ = fVar234 * (float)local_680._0_4_;
      auVar49._8_4_ = fVar236 * fStack_678;
      auVar49._12_4_ = fVar186 * fStack_674;
      auVar49._16_4_ = fVar188 * fStack_670;
      auVar49._20_4_ = fVar190 * fStack_66c;
      auVar49._24_4_ = fVar98 * fStack_668;
      auVar49._28_4_ = auVar16._28_4_;
      auVar22 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = local_220._4_4_ * fVar231;
      auVar50._0_4_ = local_220._0_4_ * fVar211;
      auVar50._8_4_ = local_220._8_4_ * fVar212;
      auVar50._12_4_ = local_220._12_4_ * fVar232;
      auVar50._16_4_ = local_220._16_4_ * fVar213;
      auVar50._20_4_ = local_220._20_4_ * fVar233;
      auVar50._24_4_ = local_220._24_4_ * fVar214;
      auVar50._28_4_ = auVar16._28_4_;
      auVar51._4_4_ = local_560._4_4_ * fVar215;
      auVar51._0_4_ = local_560._0_4_ * fVar234;
      auVar51._8_4_ = local_560._8_4_ * fVar236;
      auVar51._12_4_ = local_560._12_4_ * fVar186;
      auVar51._16_4_ = local_560._16_4_ * fVar188;
      auVar51._20_4_ = local_560._20_4_ * fVar190;
      uVar2 = local_560._28_4_;
      auVar51._24_4_ = local_560._24_4_ * fVar98;
      auVar51._28_4_ = uVar2;
      auVar23 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = auVar281._4_4_ * fVar231;
      auVar52._0_4_ = auVar281._0_4_ * fVar211;
      auVar52._8_4_ = auVar281._8_4_ * fVar212;
      auVar52._12_4_ = auVar281._12_4_ * fVar232;
      auVar52._16_4_ = auVar281._16_4_ * fVar213;
      auVar52._20_4_ = auVar281._20_4_ * fVar233;
      auVar52._24_4_ = auVar281._24_4_ * fVar214;
      auVar52._28_4_ = uVar2;
      auVar53._4_4_ = auVar251._4_4_ * fVar215;
      auVar53._0_4_ = auVar251._0_4_ * fVar234;
      auVar53._8_4_ = auVar251._8_4_ * fVar236;
      auVar53._12_4_ = auVar251._12_4_ * fVar186;
      auVar53._16_4_ = auVar251._16_4_ * fVar188;
      auVar53._20_4_ = auVar251._20_4_ * fVar190;
      auVar53._24_4_ = auVar251._24_4_ * fVar98;
      auVar53._28_4_ = auVar251._28_4_;
      auVar88 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = fVar231 * fStack_29c;
      auVar54._0_4_ = fVar211 * local_2a0;
      auVar54._8_4_ = fVar212 * fStack_298;
      auVar54._12_4_ = fVar232 * fStack_294;
      auVar54._16_4_ = fVar213 * fStack_290;
      auVar54._20_4_ = fVar233 * fStack_28c;
      auVar54._24_4_ = fVar214 * fStack_288;
      auVar54._28_4_ = uVar2;
      auVar55._4_4_ = fVar215 * fStack_27c;
      auVar55._0_4_ = fVar234 * local_280;
      auVar55._8_4_ = fVar236 * fStack_278;
      auVar55._12_4_ = fVar186 * fStack_274;
      auVar55._16_4_ = fVar188 * fStack_270;
      auVar55._20_4_ = fVar190 * fStack_26c;
      auVar55._24_4_ = fVar98 * fStack_268;
      auVar55._28_4_ = auVar281._28_4_;
      auVar89 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = fVar231 * auVar19._4_4_;
      auVar56._0_4_ = fVar211 * auVar19._0_4_;
      auVar56._8_4_ = fVar212 * auVar19._8_4_;
      auVar56._12_4_ = fVar232 * auVar19._12_4_;
      auVar56._16_4_ = fVar213 * auVar19._16_4_;
      auVar56._20_4_ = fVar233 * auVar19._20_4_;
      auVar56._24_4_ = fVar214 * auVar19._24_4_;
      auVar56._28_4_ = auVar281._28_4_;
      auVar57._4_4_ = fStack_5dc * fVar215;
      auVar57._0_4_ = local_5e0 * fVar234;
      auVar57._8_4_ = fStack_5d8 * fVar236;
      auVar57._12_4_ = fStack_5d4 * fVar186;
      auVar57._16_4_ = fStack_5d0 * fVar188;
      auVar57._20_4_ = fStack_5cc * fVar190;
      auVar57._24_4_ = fStack_5c8 * fVar98;
      auVar57._28_4_ = local_220._28_4_;
      auVar19 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = local_1e0._4_4_ * fVar231;
      auVar58._0_4_ = local_1e0._0_4_ * fVar211;
      auVar58._8_4_ = local_1e0._8_4_ * fVar212;
      auVar58._12_4_ = local_1e0._12_4_ * fVar232;
      auVar58._16_4_ = local_1e0._16_4_ * fVar213;
      auVar58._20_4_ = local_1e0._20_4_ * fVar233;
      auVar58._24_4_ = local_1e0._24_4_ * fVar214;
      auVar58._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar59._4_4_ = auVar18._4_4_ * fVar215;
      auVar59._0_4_ = auVar18._0_4_ * fVar234;
      auVar59._8_4_ = auVar18._8_4_ * fVar236;
      auVar59._12_4_ = auVar18._12_4_ * fVar186;
      auVar59._16_4_ = auVar18._16_4_ * fVar188;
      auVar59._20_4_ = auVar18._20_4_ * fVar190;
      auVar59._24_4_ = auVar18._24_4_ * fVar98;
      auVar59._28_4_ = auVar17._28_4_ + fVar218;
      auVar121 = vsubps_avx(auVar58,auVar59);
      auVar15 = vminps_avx(auVar20,auVar21);
      auVar14 = vmaxps_avx(auVar20,auVar21);
      auVar16 = vminps_avx(auVar22,auVar23);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar22,auVar23);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(auVar88,auVar89);
      auVar15 = vmaxps_avx(auVar88,auVar89);
      auVar18 = vminps_avx(auVar19,auVar121);
      auVar17 = vminps_avx(auVar17,auVar18);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar19,auVar121);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,local_1c0,2);
      auVar15 = vcmpps_avx(auVar15,local_360,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar87 = vandps_avx(local_2c0,auVar87);
      auVar15 = auVar87 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar87 = vandps_avx(auVar14,auVar87);
        uVar67 = vmovmskps_avx(auVar87);
        if (uVar67 != 0) {
          uVar64 = (ulong)uVar70;
          auStack_4b0[uVar64] = uVar67 & 0xff;
          uVar3 = vmovlps_avx(local_420);
          *(undefined8 *)(afStack_340 + uVar64 * 2) = uVar3;
          uVar69 = vmovlps_avx(auVar99);
          auStack_1a0[uVar64] = uVar69;
          uVar70 = uVar70 + 1;
        }
      }
    }
LAB_0109c38f:
    do {
      do {
        do {
          do {
            if (uVar70 == 0) {
              if (bVar71) {
                return bVar71;
              }
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar97._4_4_ = uVar2;
              auVar97._0_4_ = uVar2;
              auVar97._8_4_ = uVar2;
              auVar97._12_4_ = uVar2;
              auVar97._16_4_ = uVar2;
              auVar97._20_4_ = uVar2;
              auVar97._24_4_ = uVar2;
              auVar97._28_4_ = uVar2;
              auVar87 = vcmpps_avx(local_2e0,auVar97,2);
              uVar62 = vmovmskps_avx(auVar87);
              uVar62 = (uint)uVar65 & uVar62;
              if (uVar62 == 0) {
                return bVar71;
              }
              goto LAB_0109b459;
            }
            uVar64 = (ulong)(uVar70 - 1);
            uVar67 = auStack_4b0[uVar64];
            fVar218 = afStack_340[uVar64 * 2];
            fVar211 = afStack_340[uVar64 * 2 + 1];
            auVar222._8_8_ = 0;
            auVar222._0_8_ = auStack_1a0[uVar64];
            auVar230 = ZEXT1664(auVar222);
            uVar69 = 0;
            if (uVar67 != 0) {
              for (; (uVar67 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
              }
            }
            uVar67 = uVar67 - 1 & uVar67;
            auStack_4b0[uVar64] = uVar67;
            if (uVar67 == 0) {
              uVar70 = uVar70 - 1;
            }
            fVar212 = (float)(uVar69 + 1) * 0.14285715;
            fVar231 = (1.0 - (float)uVar69 * 0.14285715) * fVar218 +
                      fVar211 * (float)uVar69 * 0.14285715;
            fVar218 = (1.0 - fVar212) * fVar218 + fVar211 * fVar212;
            fVar211 = fVar218 - fVar231;
            if (0.16666667 <= fVar211) {
              auVar147 = vinsertps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar218),0x10);
              auVar322 = ZEXT1664(auVar147);
              goto LAB_0109bd20;
            }
            auVar147 = vshufps_avx(auVar222,auVar222,0x50);
            auVar103._8_4_ = 0x3f800000;
            auVar103._0_8_ = 0x3f8000003f800000;
            auVar103._12_4_ = 0x3f800000;
            auVar197 = vsubps_avx(auVar103,auVar147);
            fVar214 = auVar147._0_4_;
            fVar234 = auVar147._4_4_;
            fVar215 = auVar147._8_4_;
            fVar236 = auVar147._12_4_;
            fVar212 = auVar197._0_4_;
            fVar232 = auVar197._4_4_;
            fVar213 = auVar197._8_4_;
            fVar233 = auVar197._12_4_;
            auVar132._0_4_ = fVar214 * auVar290._0_4_ + fVar187 * fVar212;
            auVar132._4_4_ = fVar234 * auVar290._4_4_ + fVar189 * fVar232;
            auVar132._8_4_ = fVar215 * auVar290._0_4_ + fVar187 * fVar213;
            auVar132._12_4_ = fVar236 * auVar290._4_4_ + fVar189 * fVar233;
            auVar171._0_4_ = auVar308._0_4_ * fVar214 + fVar216 * fVar212;
            auVar171._4_4_ = auVar308._4_4_ * fVar234 + fVar168 * fVar232;
            auVar171._8_4_ = auVar308._0_4_ * fVar215 + fVar216 * fVar213;
            auVar171._12_4_ = auVar308._4_4_ * fVar236 + fVar168 * fVar233;
            auVar200._0_4_ = auVar242._0_4_ * fVar214 + auVar318._0_4_ * fVar212;
            auVar200._4_4_ = auVar242._4_4_ * fVar234 + auVar318._4_4_ * fVar232;
            auVar200._8_4_ = auVar242._0_4_ * fVar215 + auVar318._0_4_ * fVar213;
            auVar200._12_4_ = auVar242._4_4_ * fVar236 + auVar318._4_4_ * fVar233;
            auVar74._0_4_ = auVar273._0_4_ * fVar214 + fVar237 * fVar212;
            auVar74._4_4_ = auVar273._4_4_ * fVar234 + fVar185 * fVar232;
            auVar74._8_4_ = auVar273._0_4_ * fVar215 + fVar237 * fVar213;
            auVar74._12_4_ = auVar273._4_4_ * fVar236 + fVar185 * fVar233;
            auVar126._16_16_ = auVar132;
            auVar126._0_16_ = auVar132;
            auVar151._16_16_ = auVar171;
            auVar151._0_16_ = auVar171;
            auVar184._16_16_ = auVar200;
            auVar184._0_16_ = auVar200;
            auVar87 = ZEXT2032(CONCAT416(fVar218,ZEXT416((uint)fVar231)));
            auVar87 = vshufps_avx(auVar87,auVar87,0);
            auVar14 = vsubps_avx(auVar151,auVar126);
            fVar212 = auVar87._0_4_;
            fVar232 = auVar87._4_4_;
            fVar213 = auVar87._8_4_;
            fVar233 = auVar87._12_4_;
            fVar214 = auVar87._16_4_;
            fVar234 = auVar87._20_4_;
            fVar215 = auVar87._24_4_;
            auVar127._0_4_ = auVar132._0_4_ + auVar14._0_4_ * fVar212;
            auVar127._4_4_ = auVar132._4_4_ + auVar14._4_4_ * fVar232;
            auVar127._8_4_ = auVar132._8_4_ + auVar14._8_4_ * fVar213;
            auVar127._12_4_ = auVar132._12_4_ + auVar14._12_4_ * fVar233;
            auVar127._16_4_ = auVar132._0_4_ + auVar14._16_4_ * fVar214;
            auVar127._20_4_ = auVar132._4_4_ + auVar14._20_4_ * fVar234;
            auVar127._24_4_ = auVar132._8_4_ + auVar14._24_4_ * fVar215;
            auVar127._28_4_ = auVar132._12_4_ + auVar14._28_4_;
            auVar87 = vsubps_avx(auVar184,auVar151);
            auVar152._0_4_ = auVar171._0_4_ + auVar87._0_4_ * fVar212;
            auVar152._4_4_ = auVar171._4_4_ + auVar87._4_4_ * fVar232;
            auVar152._8_4_ = auVar171._8_4_ + auVar87._8_4_ * fVar213;
            auVar152._12_4_ = auVar171._12_4_ + auVar87._12_4_ * fVar233;
            auVar152._16_4_ = auVar171._0_4_ + auVar87._16_4_ * fVar214;
            auVar152._20_4_ = auVar171._4_4_ + auVar87._20_4_ * fVar234;
            auVar152._24_4_ = auVar171._8_4_ + auVar87._24_4_ * fVar215;
            auVar152._28_4_ = auVar171._12_4_ + auVar87._28_4_;
            auVar147 = vsubps_avx(auVar74,auVar200);
            auVar94._0_4_ = auVar200._0_4_ + auVar147._0_4_ * fVar212;
            auVar94._4_4_ = auVar200._4_4_ + auVar147._4_4_ * fVar232;
            auVar94._8_4_ = auVar200._8_4_ + auVar147._8_4_ * fVar213;
            auVar94._12_4_ = auVar200._12_4_ + auVar147._12_4_ * fVar233;
            auVar94._16_4_ = auVar200._0_4_ + auVar147._0_4_ * fVar214;
            auVar94._20_4_ = auVar200._4_4_ + auVar147._4_4_ * fVar234;
            auVar94._24_4_ = auVar200._8_4_ + auVar147._8_4_ * fVar215;
            auVar94._28_4_ = auVar200._12_4_ + auVar147._12_4_;
            auVar87 = vsubps_avx(auVar152,auVar127);
            auVar128._0_4_ = auVar127._0_4_ + fVar212 * auVar87._0_4_;
            auVar128._4_4_ = auVar127._4_4_ + fVar232 * auVar87._4_4_;
            auVar128._8_4_ = auVar127._8_4_ + fVar213 * auVar87._8_4_;
            auVar128._12_4_ = auVar127._12_4_ + fVar233 * auVar87._12_4_;
            auVar128._16_4_ = auVar127._16_4_ + fVar214 * auVar87._16_4_;
            auVar128._20_4_ = auVar127._20_4_ + fVar234 * auVar87._20_4_;
            auVar128._24_4_ = auVar127._24_4_ + fVar215 * auVar87._24_4_;
            auVar128._28_4_ = auVar127._28_4_ + auVar87._28_4_;
            auVar87 = vsubps_avx(auVar94,auVar152);
            auVar95._0_4_ = auVar152._0_4_ + fVar212 * auVar87._0_4_;
            auVar95._4_4_ = auVar152._4_4_ + fVar232 * auVar87._4_4_;
            auVar95._8_4_ = auVar152._8_4_ + fVar213 * auVar87._8_4_;
            auVar95._12_4_ = auVar152._12_4_ + fVar233 * auVar87._12_4_;
            auVar95._16_4_ = auVar152._16_4_ + fVar214 * auVar87._16_4_;
            auVar95._20_4_ = auVar152._20_4_ + fVar234 * auVar87._20_4_;
            auVar95._24_4_ = auVar152._24_4_ + fVar215 * auVar87._24_4_;
            auVar95._28_4_ = auVar152._28_4_ + auVar87._28_4_;
            auVar87 = vsubps_avx(auVar95,auVar128);
            auVar223._0_4_ = auVar128._0_4_ + fVar212 * auVar87._0_4_;
            auVar223._4_4_ = auVar128._4_4_ + fVar232 * auVar87._4_4_;
            auVar223._8_4_ = auVar128._8_4_ + fVar213 * auVar87._8_4_;
            auVar223._12_4_ = auVar128._12_4_ + fVar233 * auVar87._12_4_;
            auVar229._16_4_ = auVar128._16_4_ + fVar214 * auVar87._16_4_;
            auVar229._0_16_ = auVar223;
            auVar229._20_4_ = auVar128._20_4_ + fVar234 * auVar87._20_4_;
            auVar229._24_4_ = auVar128._24_4_ + fVar215 * auVar87._24_4_;
            auVar229._28_4_ = auVar128._28_4_ + auVar152._28_4_;
            auVar235 = auVar229._16_16_;
            auVar105 = vshufps_avx(ZEXT416((uint)(fVar211 * 0.33333334)),
                                   ZEXT416((uint)(fVar211 * 0.33333334)),0);
            auVar201._0_4_ = auVar223._0_4_ + auVar105._0_4_ * auVar87._0_4_ * 3.0;
            auVar201._4_4_ = auVar223._4_4_ + auVar105._4_4_ * auVar87._4_4_ * 3.0;
            auVar201._8_4_ = auVar223._8_4_ + auVar105._8_4_ * auVar87._8_4_ * 3.0;
            auVar201._12_4_ = auVar223._12_4_ + auVar105._12_4_ * auVar87._12_4_ * 3.0;
            auVar145 = vshufpd_avx(auVar223,auVar223,3);
            auVar116 = vshufpd_avx(auVar235,auVar235,3);
            _local_560 = auVar145;
            auVar147 = vsubps_avx(auVar145,auVar223);
            auVar197 = vsubps_avx(auVar116,auVar235);
            auVar75._0_4_ = auVar147._0_4_ + auVar197._0_4_;
            auVar75._4_4_ = auVar147._4_4_ + auVar197._4_4_;
            auVar75._8_4_ = auVar147._8_4_ + auVar197._8_4_;
            auVar75._12_4_ = auVar147._12_4_ + auVar197._12_4_;
            auVar147 = vmovshdup_avx(auVar223);
            auVar197 = vmovshdup_avx(auVar201);
            auVar135 = vshufps_avx(auVar75,auVar75,0);
            auVar106 = vshufps_avx(auVar75,auVar75,0x55);
            fVar212 = auVar106._0_4_;
            fVar232 = auVar106._4_4_;
            fVar213 = auVar106._8_4_;
            fVar233 = auVar106._12_4_;
            fVar214 = auVar135._0_4_;
            fVar234 = auVar135._4_4_;
            fVar215 = auVar135._8_4_;
            fVar236 = auVar135._12_4_;
            auVar76._0_4_ = fVar214 * auVar223._0_4_ + auVar147._0_4_ * fVar212;
            auVar76._4_4_ = fVar234 * auVar223._4_4_ + auVar147._4_4_ * fVar232;
            auVar76._8_4_ = fVar215 * auVar223._8_4_ + auVar147._8_4_ * fVar213;
            auVar76._12_4_ = fVar236 * auVar223._12_4_ + auVar147._12_4_ * fVar233;
            auVar133._0_4_ = fVar214 * auVar201._0_4_ + auVar197._0_4_ * fVar212;
            auVar133._4_4_ = fVar234 * auVar201._4_4_ + auVar197._4_4_ * fVar232;
            auVar133._8_4_ = fVar215 * auVar201._8_4_ + auVar197._8_4_ * fVar213;
            auVar133._12_4_ = fVar236 * auVar201._12_4_ + auVar197._12_4_ * fVar233;
            auVar197 = vshufps_avx(auVar76,auVar76,0xe8);
            auVar135 = vshufps_avx(auVar133,auVar133,0xe8);
            auVar147 = vcmpps_avx(auVar197,auVar135,1);
            uVar67 = vextractps_avx(auVar147,0);
            auVar106 = auVar133;
            if ((uVar67 & 1) == 0) {
              auVar106 = auVar76;
            }
            auVar104._0_4_ = auVar105._0_4_ * auVar87._16_4_ * 3.0;
            auVar104._4_4_ = auVar105._4_4_ * auVar87._20_4_ * 3.0;
            auVar104._8_4_ = auVar105._8_4_ * auVar87._24_4_ * 3.0;
            auVar104._12_4_ = auVar105._12_4_ * 0.0;
            auVar72 = vsubps_avx(auVar235,auVar104);
            auVar105 = vmovshdup_avx(auVar72);
            auVar235 = vmovshdup_avx(auVar235);
            fVar186 = auVar72._0_4_;
            fVar188 = auVar72._4_4_;
            auVar172._0_4_ = fVar186 * fVar214 + auVar105._0_4_ * fVar212;
            auVar172._4_4_ = fVar188 * fVar234 + auVar105._4_4_ * fVar232;
            auVar172._8_4_ = auVar72._8_4_ * fVar215 + auVar105._8_4_ * fVar213;
            auVar172._12_4_ = auVar72._12_4_ * fVar236 + auVar105._12_4_ * fVar233;
            auVar202._0_4_ = fVar214 * auVar229._16_4_ + auVar235._0_4_ * fVar212;
            auVar202._4_4_ = fVar234 * auVar229._20_4_ + auVar235._4_4_ * fVar232;
            auVar202._8_4_ = fVar215 * auVar229._24_4_ + auVar235._8_4_ * fVar213;
            auVar202._12_4_ = fVar236 * auVar229._28_4_ + auVar235._12_4_ * fVar233;
            auVar235 = vshufps_avx(auVar172,auVar172,0xe8);
            auVar6 = vshufps_avx(auVar202,auVar202,0xe8);
            auVar105 = vcmpps_avx(auVar235,auVar6,1);
            uVar67 = vextractps_avx(auVar105,0);
            auVar99 = auVar202;
            if ((uVar67 & 1) == 0) {
              auVar99 = auVar172;
            }
            auVar106 = vmaxss_avx(auVar99,auVar106);
            auVar197 = vminps_avx(auVar197,auVar135);
            auVar135 = vminps_avx(auVar235,auVar6);
            auVar135 = vminps_avx(auVar197,auVar135);
            auVar147 = vshufps_avx(auVar147,auVar147,0x55);
            auVar147 = vblendps_avx(auVar147,auVar105,2);
            auVar105 = vpslld_avx(auVar147,0x1f);
            auVar147 = vshufpd_avx(auVar133,auVar133,1);
            auVar147 = vinsertps_avx(auVar147,auVar202,0x9c);
            auVar197 = vshufpd_avx(auVar76,auVar76,1);
            auVar197 = vinsertps_avx(auVar197,auVar172,0x9c);
            auVar147 = vblendvps_avx(auVar197,auVar147,auVar105);
            auVar197 = vmovshdup_avx(auVar147);
            auVar147 = vmaxss_avx(auVar197,auVar147);
            fVar213 = auVar135._0_4_;
            auVar197 = vmovshdup_avx(auVar135);
            fVar232 = auVar147._0_4_;
            fVar233 = auVar197._0_4_;
            fVar212 = auVar106._0_4_;
            if ((fVar213 < 0.0001) && (-0.0001 < fVar232)) break;
            if ((fVar233 < 0.0001 && -0.0001 < fVar212) || (fVar213 < 0.0001 && -0.0001 < fVar212))
            break;
            auVar105 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar147,1);
            auVar197 = vcmpps_avx(auVar197,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar197 = vandps_avx(auVar197,auVar105);
          } while ((auVar197 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar105 = vcmpps_avx(auVar135,_DAT_01f7aa10,1);
          auVar197 = vcmpss_avx(auVar106,ZEXT416(0),1);
          auVar134._8_4_ = 0x3f800000;
          auVar134._0_8_ = 0x3f8000003f800000;
          auVar134._12_4_ = 0x3f800000;
          auVar173._8_4_ = 0xbf800000;
          auVar173._0_8_ = 0xbf800000bf800000;
          auVar173._12_4_ = 0xbf800000;
          auVar197 = vblendvps_avx(auVar134,auVar173,auVar197);
          auVar105 = vblendvps_avx(auVar134,auVar173,auVar105);
          auVar135 = vcmpss_avx(auVar105,auVar197,4);
          auVar135 = vpshufd_avx(ZEXT416(auVar135._0_4_ & 1),0x50);
          auVar135 = vpslld_avx(auVar135,0x1f);
          auVar135 = vpsrad_avx(auVar135,0x1f);
          auVar135 = vpandn_avx(auVar135,_DAT_01fafeb0);
          auVar106 = vmovshdup_avx(auVar105);
          fVar214 = auVar106._0_4_;
          local_690._0_4_ = auVar4._0_4_;
          local_690._4_4_ = auVar4._4_4_;
          fStack_688 = auVar4._8_4_;
          fStack_684 = auVar4._12_4_;
          if ((auVar105._0_4_ != fVar214) || (NAN(auVar105._0_4_) || NAN(fVar214))) {
            if ((fVar233 != fVar213) || (NAN(fVar233) || NAN(fVar213))) {
              fVar213 = -fVar213 / (fVar233 - fVar213);
              auVar105 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar213) * 0.0 + fVar213)));
            }
            else {
              auVar105 = ZEXT816(0x3f80000000000000);
              if ((fVar213 != 0.0) || (NAN(fVar213))) {
                auVar105 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar235 = vcmpps_avx(auVar135,auVar105,1);
            auVar106 = vblendps_avx(auVar135,auVar105,2);
            auVar105 = vblendps_avx(auVar105,auVar135,2);
            auVar135 = vblendvps_avx(auVar105,auVar106,auVar235);
          }
          auVar147 = vcmpss_avx(auVar147,ZEXT416(0),1);
          auVar136._8_4_ = 0x3f800000;
          auVar136._0_8_ = 0x3f8000003f800000;
          auVar136._12_4_ = 0x3f800000;
          auVar174._8_4_ = 0xbf800000;
          auVar174._0_8_ = 0xbf800000bf800000;
          auVar174._12_4_ = 0xbf800000;
          auVar147 = vblendvps_avx(auVar136,auVar174,auVar147);
          fVar213 = auVar147._0_4_;
          if ((auVar197._0_4_ != fVar213) || (NAN(auVar197._0_4_) || NAN(fVar213))) {
            if ((fVar232 != fVar212) || (NAN(fVar232) || NAN(fVar212))) {
              fVar212 = -fVar212 / (fVar232 - fVar212);
              auVar147 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar212) * 0.0 + fVar212)));
            }
            else {
              auVar147 = ZEXT816(0x3f80000000000000);
              if ((fVar212 != 0.0) || (NAN(fVar212))) {
                auVar147 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar105 = vcmpps_avx(auVar135,auVar147,1);
            auVar197 = vblendps_avx(auVar135,auVar147,2);
            auVar147 = vblendps_avx(auVar147,auVar135,2);
            auVar135 = vblendvps_avx(auVar147,auVar197,auVar105);
          }
          if ((fVar214 != fVar213) || (NAN(fVar214) || NAN(fVar213))) {
            auVar77._8_4_ = 0x3f800000;
            auVar77._0_8_ = 0x3f8000003f800000;
            auVar77._12_4_ = 0x3f800000;
            auVar147 = vcmpps_avx(auVar135,auVar77,1);
            auVar197 = vinsertps_avx(auVar135,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar137._4_12_ = auVar135._4_12_;
            auVar137._0_4_ = 0x3f800000;
            auVar135 = vblendvps_avx(auVar137,auVar197,auVar147);
          }
          auVar147 = vcmpps_avx(auVar135,_DAT_01f7b6f0,1);
          auVar60._12_4_ = 0;
          auVar60._0_12_ = auVar135._4_12_;
          auVar197 = vinsertps_avx(auVar135,ZEXT416(0x3f800000),0x10);
          auVar147 = vblendvps_avx(auVar197,auVar60 << 0x20,auVar147);
          auVar197 = vmovshdup_avx(auVar147);
        } while (auVar197._0_4_ < auVar147._0_4_);
        auVar78._0_4_ = auVar147._0_4_ + -0.1;
        auVar78._4_4_ = auVar147._4_4_ + 0.1;
        auVar78._8_4_ = auVar147._8_4_ + 0.0;
        auVar78._12_4_ = auVar147._12_4_ + 0.0;
        auVar105 = vshufpd_avx(auVar201,auVar201,3);
        auVar224._8_8_ = 0x3f80000000000000;
        auVar224._0_8_ = 0x3f80000000000000;
        auVar147 = vcmpps_avx(auVar78,auVar224,1);
        auVar61._12_4_ = 0;
        auVar61._0_12_ = auVar78._4_12_;
        auVar197 = vinsertps_avx(auVar78,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar147 = vblendvps_avx(auVar197,auVar61 << 0x20,auVar147);
        auVar197 = vshufpd_avx(auVar72,auVar72,3);
        auVar135 = vshufps_avx(auVar147,auVar147,0x50);
        auVar225._8_4_ = 0x3f800000;
        auVar225._0_8_ = 0x3f8000003f800000;
        auVar225._12_4_ = 0x3f800000;
        auVar106 = vsubps_avx(auVar225,auVar135);
        local_560._0_4_ = auVar145._0_4_;
        local_560._4_4_ = auVar145._4_4_;
        fStack_558 = auVar145._8_4_;
        fStack_554 = auVar145._12_4_;
        fVar212 = auVar135._0_4_;
        fVar232 = auVar135._4_4_;
        fVar213 = auVar135._8_4_;
        fVar233 = auVar135._12_4_;
        local_600 = auVar116._0_4_;
        fStack_5fc = auVar116._4_4_;
        fStack_5f8 = auVar116._8_4_;
        fStack_5f4 = auVar116._12_4_;
        fVar214 = auVar106._0_4_;
        fVar234 = auVar106._4_4_;
        fVar215 = auVar106._8_4_;
        fVar236 = auVar106._12_4_;
        auVar79._0_4_ = fVar212 * (float)local_560._0_4_ + fVar214 * auVar223._0_4_;
        auVar79._4_4_ = fVar232 * (float)local_560._4_4_ + fVar234 * auVar223._4_4_;
        auVar79._8_4_ = fVar213 * fStack_558 + fVar215 * auVar223._0_4_;
        auVar79._12_4_ = fVar233 * fStack_554 + fVar236 * auVar223._4_4_;
        auVar138._0_4_ = fVar212 * auVar105._0_4_ + fVar214 * auVar201._0_4_;
        auVar138._4_4_ = fVar232 * auVar105._4_4_ + fVar234 * auVar201._4_4_;
        auVar138._8_4_ = fVar213 * auVar105._8_4_ + fVar215 * auVar201._0_4_;
        auVar138._12_4_ = fVar233 * auVar105._12_4_ + fVar236 * auVar201._4_4_;
        auVar203._0_4_ = fVar212 * auVar197._0_4_ + fVar214 * fVar186;
        auVar203._4_4_ = fVar232 * auVar197._4_4_ + fVar234 * fVar188;
        auVar203._8_4_ = fVar213 * auVar197._8_4_ + fVar215 * fVar186;
        auVar203._12_4_ = fVar233 * auVar197._12_4_ + fVar236 * fVar188;
        auVar244._0_4_ = fVar212 * local_600 + fVar214 * auVar229._16_4_;
        auVar244._4_4_ = fVar232 * fStack_5fc + fVar234 * auVar229._20_4_;
        auVar244._8_4_ = fVar213 * fStack_5f8 + fVar215 * auVar229._16_4_;
        auVar244._12_4_ = fVar233 * fStack_5f4 + fVar236 * auVar229._20_4_;
        auVar116 = vsubps_avx(auVar225,auVar147);
        auVar197 = vmovshdup_avx(auVar222);
        auVar145 = vmovsldup_avx(auVar222);
        auVar226._0_4_ = auVar145._0_4_ * auVar116._0_4_ + auVar147._0_4_ * auVar197._0_4_;
        auVar226._4_4_ = auVar145._4_4_ * auVar116._4_4_ + auVar147._4_4_ * auVar197._4_4_;
        auVar226._8_4_ = auVar145._8_4_ * auVar116._8_4_ + auVar147._8_4_ * auVar197._8_4_;
        auVar226._12_4_ = auVar145._12_4_ * auVar116._12_4_ + auVar147._12_4_ * auVar197._12_4_;
        auVar72 = vmovshdup_avx(auVar226);
        auVar147 = vsubps_avx(auVar138,auVar79);
        auVar160._0_4_ = auVar147._0_4_ * 3.0;
        auVar160._4_4_ = auVar147._4_4_ * 3.0;
        auVar160._8_4_ = auVar147._8_4_ * 3.0;
        auVar160._12_4_ = auVar147._12_4_ * 3.0;
        auVar147 = vsubps_avx(auVar203,auVar138);
        auVar256._0_4_ = auVar147._0_4_ * 3.0;
        auVar256._4_4_ = auVar147._4_4_ * 3.0;
        auVar256._8_4_ = auVar147._8_4_ * 3.0;
        auVar256._12_4_ = auVar147._12_4_ * 3.0;
        auVar147 = vsubps_avx(auVar244,auVar203);
        auVar274._0_4_ = auVar147._0_4_ * 3.0;
        auVar274._4_4_ = auVar147._4_4_ * 3.0;
        auVar274._8_4_ = auVar147._8_4_ * 3.0;
        auVar274._12_4_ = auVar147._12_4_ * 3.0;
        auVar197 = vminps_avx(auVar256,auVar274);
        auVar147 = vmaxps_avx(auVar256,auVar274);
        auVar197 = vminps_avx(auVar160,auVar197);
        auVar147 = vmaxps_avx(auVar160,auVar147);
        auVar145 = vshufpd_avx(auVar197,auVar197,3);
        auVar116 = vshufpd_avx(auVar147,auVar147,3);
        auVar197 = vminps_avx(auVar197,auVar145);
        auVar147 = vmaxps_avx(auVar147,auVar116);
        auVar145 = vshufps_avx(ZEXT416((uint)(1.0 / fVar211)),ZEXT416((uint)(1.0 / fVar211)),0);
        auVar257._0_4_ = auVar197._0_4_ * auVar145._0_4_;
        auVar257._4_4_ = auVar197._4_4_ * auVar145._4_4_;
        auVar257._8_4_ = auVar197._8_4_ * auVar145._8_4_;
        auVar257._12_4_ = auVar197._12_4_ * auVar145._12_4_;
        auVar275._0_4_ = auVar145._0_4_ * auVar147._0_4_;
        auVar275._4_4_ = auVar145._4_4_ * auVar147._4_4_;
        auVar275._8_4_ = auVar145._8_4_ * auVar147._8_4_;
        auVar275._12_4_ = auVar145._12_4_ * auVar147._12_4_;
        auVar106 = ZEXT416((uint)(1.0 / (auVar72._0_4_ - auVar226._0_4_)));
        auVar147 = vshufpd_avx(auVar79,auVar79,3);
        auVar197 = vshufpd_avx(auVar138,auVar138,3);
        auVar145 = vshufpd_avx(auVar203,auVar203,3);
        auVar116 = vshufpd_avx(auVar244,auVar244,3);
        auVar147 = vsubps_avx(auVar147,auVar79);
        auVar105 = vsubps_avx(auVar197,auVar138);
        auVar135 = vsubps_avx(auVar145,auVar203);
        auVar116 = vsubps_avx(auVar116,auVar244);
        auVar197 = vminps_avx(auVar147,auVar105);
        auVar147 = vmaxps_avx(auVar147,auVar105);
        auVar145 = vminps_avx(auVar135,auVar116);
        auVar145 = vminps_avx(auVar197,auVar145);
        auVar197 = vmaxps_avx(auVar135,auVar116);
        auVar147 = vmaxps_avx(auVar147,auVar197);
        auVar197 = vshufps_avx(auVar106,auVar106,0);
        auVar319._0_4_ = auVar197._0_4_ * auVar145._0_4_;
        auVar319._4_4_ = auVar197._4_4_ * auVar145._4_4_;
        auVar319._8_4_ = auVar197._8_4_ * auVar145._8_4_;
        auVar319._12_4_ = auVar197._12_4_ * auVar145._12_4_;
        auVar325._0_4_ = auVar197._0_4_ * auVar147._0_4_;
        auVar325._4_4_ = auVar197._4_4_ * auVar147._4_4_;
        auVar325._8_4_ = auVar197._8_4_ * auVar147._8_4_;
        auVar325._12_4_ = auVar197._12_4_ * auVar147._12_4_;
        auVar147 = vmovsldup_avx(auVar226);
        auVar291._4_12_ = auVar147._4_12_;
        auVar291._0_4_ = fVar231;
        auVar299._4_12_ = auVar226._4_12_;
        auVar299._0_4_ = fVar218;
        auVar161._0_4_ = (fVar231 + fVar218) * 0.5;
        auVar161._4_4_ = (auVar147._4_4_ + auVar226._4_4_) * 0.5;
        auVar161._8_4_ = (auVar147._8_4_ + auVar226._8_4_) * 0.5;
        auVar161._12_4_ = (auVar147._12_4_ + auVar226._12_4_) * 0.5;
        auVar147 = vshufps_avx(auVar161,auVar161,0);
        fVar212 = auVar147._0_4_;
        fVar232 = auVar147._4_4_;
        fVar213 = auVar147._8_4_;
        fVar233 = auVar147._12_4_;
        auVar107._0_4_ = (float)local_690._0_4_ + fVar212 * (float)local_370._0_4_;
        auVar107._4_4_ = (float)local_690._4_4_ + fVar232 * (float)local_370._4_4_;
        auVar107._8_4_ = fStack_688 + fVar213 * fStack_368;
        auVar107._12_4_ = fStack_684 + fVar233 * fStack_364;
        local_660._0_4_ = auVar298._0_4_;
        local_660._4_4_ = auVar298._4_4_;
        fStack_658 = auVar298._8_4_;
        fStack_654 = auVar298._12_4_;
        auVar139._0_4_ = fVar212 * (float)local_380._0_4_ + (float)local_660._0_4_;
        auVar139._4_4_ = fVar232 * (float)local_380._4_4_ + (float)local_660._4_4_;
        auVar139._8_4_ = fVar213 * fStack_378 + fStack_658;
        auVar139._12_4_ = fVar233 * fStack_374 + fStack_654;
        local_5a0 = auVar5._0_4_;
        fStack_59c = auVar5._4_4_;
        fStack_598 = auVar5._8_4_;
        fStack_594 = auVar5._12_4_;
        auVar204._0_4_ = fVar212 * (float)local_390._0_4_ + local_5a0;
        auVar204._4_4_ = fVar232 * (float)local_390._4_4_ + fStack_59c;
        auVar204._8_4_ = fVar213 * fStack_388 + fStack_598;
        auVar204._12_4_ = fVar233 * fStack_384 + fStack_594;
        auVar147 = vsubps_avx(auVar139,auVar107);
        auVar108._0_4_ = auVar107._0_4_ + fVar212 * auVar147._0_4_;
        auVar108._4_4_ = auVar107._4_4_ + fVar232 * auVar147._4_4_;
        auVar108._8_4_ = auVar107._8_4_ + fVar213 * auVar147._8_4_;
        auVar108._12_4_ = auVar107._12_4_ + fVar233 * auVar147._12_4_;
        auVar147 = vsubps_avx(auVar204,auVar139);
        auVar140._0_4_ = auVar139._0_4_ + fVar212 * auVar147._0_4_;
        auVar140._4_4_ = auVar139._4_4_ + fVar232 * auVar147._4_4_;
        auVar140._8_4_ = auVar139._8_4_ + fVar213 * auVar147._8_4_;
        auVar140._12_4_ = auVar139._12_4_ + fVar233 * auVar147._12_4_;
        auVar147 = vsubps_avx(auVar140,auVar108);
        fVar212 = auVar108._0_4_ + fVar212 * auVar147._0_4_;
        fVar232 = auVar108._4_4_ + fVar232 * auVar147._4_4_;
        auVar80._0_8_ = CONCAT44(fVar232,fVar212);
        auVar80._8_4_ = auVar108._8_4_ + fVar213 * auVar147._8_4_;
        auVar80._12_4_ = auVar108._12_4_ + fVar233 * auVar147._12_4_;
        fVar213 = auVar147._0_4_ * 3.0;
        fVar233 = auVar147._4_4_ * 3.0;
        auVar109._0_8_ = CONCAT44(fVar233,fVar213);
        auVar109._8_4_ = auVar147._8_4_ * 3.0;
        auVar109._12_4_ = auVar147._12_4_ * 3.0;
        auVar141._8_8_ = auVar80._0_8_;
        auVar141._0_8_ = auVar80._0_8_;
        auVar147 = vshufpd_avx(auVar80,auVar80,3);
        auVar197 = vshufps_avx(auVar161,auVar161,0x55);
        auVar135 = vsubps_avx(auVar147,auVar141);
        auVar309._0_4_ = auVar135._0_4_ * auVar197._0_4_ + fVar212;
        auVar309._4_4_ = auVar135._4_4_ * auVar197._4_4_ + fVar232;
        auVar309._8_4_ = auVar135._8_4_ * auVar197._8_4_ + fVar212;
        auVar309._12_4_ = auVar135._12_4_ * auVar197._12_4_ + fVar232;
        auVar142._8_8_ = auVar109._0_8_;
        auVar142._0_8_ = auVar109._0_8_;
        auVar147 = vshufpd_avx(auVar109,auVar109,1);
        auVar147 = vsubps_avx(auVar147,auVar142);
        auVar110._0_4_ = auVar147._0_4_ * auVar197._0_4_ + fVar213;
        auVar110._4_4_ = auVar147._4_4_ * auVar197._4_4_ + fVar233;
        auVar110._8_4_ = auVar147._8_4_ * auVar197._8_4_ + fVar213;
        auVar110._12_4_ = auVar147._12_4_ * auVar197._12_4_ + fVar233;
        auVar197 = vmovshdup_avx(auVar110);
        auVar205._0_8_ = auVar197._0_8_ ^ 0x8000000080000000;
        auVar205._8_4_ = auVar197._8_4_ ^ 0x80000000;
        auVar205._12_4_ = auVar197._12_4_ ^ 0x80000000;
        auVar145 = vmovshdup_avx(auVar135);
        auVar147 = vunpcklps_avx(auVar145,auVar205);
        auVar116 = vshufps_avx(auVar147,auVar205,4);
        auVar81._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
        auVar81._8_4_ = -auVar135._8_4_;
        auVar81._12_4_ = -auVar135._12_4_;
        auVar147 = vmovlhps_avx(auVar81,auVar110);
        auVar105 = vshufps_avx(auVar147,auVar110,8);
        auVar147 = ZEXT416((uint)(auVar110._0_4_ * auVar145._0_4_ - auVar135._0_4_ * auVar197._0_4_)
                          );
        auVar197 = vshufps_avx(auVar147,auVar147,0);
        auVar147 = vdivps_avx(auVar116,auVar197);
        auVar197 = vdivps_avx(auVar105,auVar197);
        auVar105 = vinsertps_avx(auVar257,auVar319,0x1c);
        auVar135 = vinsertps_avx(auVar275,auVar325,0x1c);
        auVar106 = vinsertps_avx(auVar319,auVar257,0x4c);
        auVar235 = vinsertps_avx(auVar325,auVar275,0x4c);
        auVar145 = vmovsldup_avx(auVar147);
        auVar276._0_4_ = auVar105._0_4_ * auVar145._0_4_;
        auVar276._4_4_ = auVar105._4_4_ * auVar145._4_4_;
        auVar276._8_4_ = auVar105._8_4_ * auVar145._8_4_;
        auVar276._12_4_ = auVar105._12_4_ * auVar145._12_4_;
        auVar111._0_4_ = auVar145._0_4_ * auVar135._0_4_;
        auVar111._4_4_ = auVar145._4_4_ * auVar135._4_4_;
        auVar111._8_4_ = auVar145._8_4_ * auVar135._8_4_;
        auVar111._12_4_ = auVar145._12_4_ * auVar135._12_4_;
        auVar116 = vminps_avx(auVar276,auVar111);
        auVar145 = vmaxps_avx(auVar111,auVar276);
        auVar6 = vmovsldup_avx(auVar197);
        auVar326._0_4_ = auVar6._0_4_ * auVar106._0_4_;
        auVar326._4_4_ = auVar6._4_4_ * auVar106._4_4_;
        auVar326._8_4_ = auVar6._8_4_ * auVar106._8_4_;
        auVar326._12_4_ = auVar6._12_4_ * auVar106._12_4_;
        auVar277._0_4_ = auVar6._0_4_ * auVar235._0_4_;
        auVar277._4_4_ = auVar6._4_4_ * auVar235._4_4_;
        auVar277._8_4_ = auVar6._8_4_ * auVar235._8_4_;
        auVar277._12_4_ = auVar6._12_4_ * auVar235._12_4_;
        auVar6 = vminps_avx(auVar326,auVar277);
        auVar175._0_4_ = auVar116._0_4_ + auVar6._0_4_;
        auVar175._4_4_ = auVar116._4_4_ + auVar6._4_4_;
        auVar175._8_4_ = auVar116._8_4_ + auVar6._8_4_;
        auVar175._12_4_ = auVar116._12_4_ + auVar6._12_4_;
        auVar116 = vmaxps_avx(auVar277,auVar326);
        auVar6 = vsubps_avx(auVar291,auVar161);
        auVar99 = vsubps_avx(auVar299,auVar161);
        auVar112._0_4_ = auVar116._0_4_ + auVar145._0_4_;
        auVar112._4_4_ = auVar116._4_4_ + auVar145._4_4_;
        auVar112._8_4_ = auVar116._8_4_ + auVar145._8_4_;
        auVar112._12_4_ = auVar116._12_4_ + auVar145._12_4_;
        auVar300._8_8_ = 0x3f800000;
        auVar300._0_8_ = 0x3f800000;
        auVar145 = vsubps_avx(auVar300,auVar112);
        auVar116 = vsubps_avx(auVar300,auVar175);
        fVar215 = auVar6._0_4_;
        auVar301._0_4_ = fVar215 * auVar145._0_4_;
        fVar236 = auVar6._4_4_;
        auVar301._4_4_ = fVar236 * auVar145._4_4_;
        fVar186 = auVar6._8_4_;
        auVar301._8_4_ = fVar186 * auVar145._8_4_;
        fVar188 = auVar6._12_4_;
        auVar301._12_4_ = fVar188 * auVar145._12_4_;
        fVar213 = auVar99._0_4_;
        auVar113._0_4_ = fVar213 * auVar145._0_4_;
        fVar233 = auVar99._4_4_;
        auVar113._4_4_ = fVar233 * auVar145._4_4_;
        fVar214 = auVar99._8_4_;
        auVar113._8_4_ = fVar214 * auVar145._8_4_;
        fVar234 = auVar99._12_4_;
        auVar113._12_4_ = fVar234 * auVar145._12_4_;
        auVar320._0_4_ = fVar215 * auVar116._0_4_;
        auVar320._4_4_ = fVar236 * auVar116._4_4_;
        auVar320._8_4_ = fVar186 * auVar116._8_4_;
        auVar320._12_4_ = fVar188 * auVar116._12_4_;
        auVar176._0_4_ = fVar213 * auVar116._0_4_;
        auVar176._4_4_ = fVar233 * auVar116._4_4_;
        auVar176._8_4_ = fVar214 * auVar116._8_4_;
        auVar176._12_4_ = fVar234 * auVar116._12_4_;
        auVar145 = vminps_avx(auVar301,auVar320);
        auVar116 = vminps_avx(auVar113,auVar176);
        auVar6 = vminps_avx(auVar145,auVar116);
        auVar145 = vmaxps_avx(auVar320,auVar301);
        auVar116 = vmaxps_avx(auVar176,auVar113);
        auVar99 = vshufps_avx(auVar161,auVar161,0x54);
        auVar116 = vmaxps_avx(auVar116,auVar145);
        auVar100 = vshufps_avx(auVar309,auVar309,0);
        auVar130 = vshufps_avx(auVar309,auVar309,0x55);
        auVar145 = vhaddps_avx(auVar6,auVar6);
        auVar116 = vhaddps_avx(auVar116,auVar116);
        auVar177._0_4_ = auVar130._0_4_ * auVar197._0_4_ + auVar100._0_4_ * auVar147._0_4_;
        auVar177._4_4_ = auVar130._4_4_ * auVar197._4_4_ + auVar100._4_4_ * auVar147._4_4_;
        auVar177._8_4_ = auVar130._8_4_ * auVar197._8_4_ + auVar100._8_4_ * auVar147._8_4_;
        auVar177._12_4_ = auVar130._12_4_ * auVar197._12_4_ + auVar100._12_4_ * auVar147._12_4_;
        auVar6 = vsubps_avx(auVar99,auVar177);
        fVar212 = auVar6._0_4_ + auVar145._0_4_;
        fVar232 = auVar6._0_4_ + auVar116._0_4_;
        auVar145 = vmaxss_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar212));
        auVar116 = vminss_avx(ZEXT416((uint)fVar232),ZEXT416((uint)fVar218));
      } while (auVar116._0_4_ < auVar145._0_4_);
      auVar145 = vmovshdup_avx(auVar147);
      auVar178._0_4_ = auVar105._0_4_ * auVar145._0_4_;
      auVar178._4_4_ = auVar105._4_4_ * auVar145._4_4_;
      auVar178._8_4_ = auVar105._8_4_ * auVar145._8_4_;
      auVar178._12_4_ = auVar105._12_4_ * auVar145._12_4_;
      auVar114._0_4_ = auVar145._0_4_ * auVar135._0_4_;
      auVar114._4_4_ = auVar145._4_4_ * auVar135._4_4_;
      auVar114._8_4_ = auVar145._8_4_ * auVar135._8_4_;
      auVar114._12_4_ = auVar145._12_4_ * auVar135._12_4_;
      auVar116 = vminps_avx(auVar178,auVar114);
      auVar145 = vmaxps_avx(auVar114,auVar178);
      auVar105 = vmovshdup_avx(auVar197);
      auVar82._0_4_ = auVar105._0_4_ * auVar106._0_4_;
      auVar82._4_4_ = auVar105._4_4_ * auVar106._4_4_;
      auVar82._8_4_ = auVar105._8_4_ * auVar106._8_4_;
      auVar82._12_4_ = auVar105._12_4_ * auVar106._12_4_;
      auVar179._0_4_ = auVar235._0_4_ * auVar105._0_4_;
      auVar179._4_4_ = auVar235._4_4_ * auVar105._4_4_;
      auVar179._8_4_ = auVar235._8_4_ * auVar105._8_4_;
      auVar179._12_4_ = auVar235._12_4_ * auVar105._12_4_;
      auVar105 = vminps_avx(auVar82,auVar179);
      auVar143._0_4_ = auVar116._0_4_ + auVar105._0_4_;
      auVar143._4_4_ = auVar116._4_4_ + auVar105._4_4_;
      auVar143._8_4_ = auVar116._8_4_ + auVar105._8_4_;
      auVar143._12_4_ = auVar116._12_4_ + auVar105._12_4_;
      auVar116 = vmaxps_avx(auVar179,auVar82);
      auVar83._0_4_ = auVar145._0_4_ + auVar116._0_4_;
      auVar83._4_4_ = auVar145._4_4_ + auVar116._4_4_;
      auVar83._8_4_ = auVar145._8_4_ + auVar116._8_4_;
      auVar83._12_4_ = auVar145._12_4_ + auVar116._12_4_;
      auVar145 = vsubps_avx(auVar224,auVar83);
      auVar116 = vsubps_avx(auVar224,auVar143);
      auVar144._0_4_ = fVar215 * auVar145._0_4_;
      auVar144._4_4_ = fVar236 * auVar145._4_4_;
      auVar144._8_4_ = fVar186 * auVar145._8_4_;
      auVar144._12_4_ = fVar188 * auVar145._12_4_;
      auVar180._0_4_ = fVar215 * auVar116._0_4_;
      auVar180._4_4_ = fVar236 * auVar116._4_4_;
      auVar180._8_4_ = fVar186 * auVar116._8_4_;
      auVar180._12_4_ = fVar188 * auVar116._12_4_;
      auVar84._0_4_ = fVar213 * auVar145._0_4_;
      auVar84._4_4_ = fVar233 * auVar145._4_4_;
      auVar84._8_4_ = fVar214 * auVar145._8_4_;
      auVar84._12_4_ = fVar234 * auVar145._12_4_;
      auVar115._0_4_ = fVar213 * auVar116._0_4_;
      auVar115._4_4_ = fVar233 * auVar116._4_4_;
      auVar115._8_4_ = fVar214 * auVar116._8_4_;
      auVar115._12_4_ = fVar234 * auVar116._12_4_;
      auVar145 = vminps_avx(auVar144,auVar180);
      auVar116 = vminps_avx(auVar84,auVar115);
      auVar145 = vminps_avx(auVar145,auVar116);
      auVar116 = vmaxps_avx(auVar180,auVar144);
      auVar105 = vmaxps_avx(auVar115,auVar84);
      auVar145 = vhaddps_avx(auVar145,auVar145);
      auVar116 = vmaxps_avx(auVar105,auVar116);
      auVar116 = vhaddps_avx(auVar116,auVar116);
      auVar105 = vmovshdup_avx(auVar6);
      auVar230 = ZEXT1664(auVar226);
      auVar135 = ZEXT416((uint)(auVar105._0_4_ + auVar145._0_4_));
      auVar145 = vmaxss_avx(auVar226,auVar135);
      auVar105 = ZEXT416((uint)(auVar105._0_4_ + auVar116._0_4_));
      auVar116 = vminss_avx(auVar105,auVar72);
      auVar258._8_4_ = 0x7fffffff;
      auVar258._0_8_ = 0x7fffffff7fffffff;
      auVar258._12_4_ = 0x7fffffff;
    } while (auVar116._0_4_ < auVar145._0_4_);
    uVar67 = 0;
    if ((fVar231 < fVar212) && (fVar232 < fVar218)) {
      auVar145 = vcmpps_avx(auVar105,auVar72,1);
      auVar116 = vcmpps_avx(auVar226,auVar135,1);
      auVar145 = vandps_avx(auVar116,auVar145);
      uVar67 = auVar145._0_4_;
    }
    if ((3 < uVar70 || fVar211 < 0.001) || (uVar67 & 1) != 0) {
      lVar68 = 200;
      do {
        fVar211 = auVar6._0_4_;
        fVar218 = 1.0 - fVar211;
        auVar145 = ZEXT416((uint)(fVar218 * fVar218 * fVar218));
        auVar145 = vshufps_avx(auVar145,auVar145,0);
        auVar116 = ZEXT416((uint)(fVar211 * 3.0 * fVar218 * fVar218));
        auVar116 = vshufps_avx(auVar116,auVar116,0);
        auVar105 = ZEXT416((uint)(fVar218 * fVar211 * fVar211 * 3.0));
        auVar105 = vshufps_avx(auVar105,auVar105,0);
        auVar135 = ZEXT416((uint)(fVar211 * fVar211 * fVar211));
        auVar135 = vshufps_avx(auVar135,auVar135,0);
        fVar218 = (float)local_690._0_4_ * auVar145._0_4_ +
                  (float)local_660._0_4_ * auVar116._0_4_ +
                  (float)local_4c0._0_4_ * auVar135._0_4_ + local_5a0 * auVar105._0_4_;
        fVar211 = (float)local_690._4_4_ * auVar145._4_4_ +
                  (float)local_660._4_4_ * auVar116._4_4_ +
                  (float)local_4c0._4_4_ * auVar135._4_4_ + fStack_59c * auVar105._4_4_;
        auVar85._0_8_ = CONCAT44(fVar211,fVar218);
        auVar85._8_4_ =
             fStack_688 * auVar145._8_4_ +
             fStack_658 * auVar116._8_4_ + fStack_4b8 * auVar135._8_4_ + fStack_598 * auVar105._8_4_
        ;
        auVar85._12_4_ =
             fStack_684 * auVar145._12_4_ +
             fStack_654 * auVar116._12_4_ +
             fStack_4b4 * auVar135._12_4_ + fStack_594 * auVar105._12_4_;
        auVar117._8_8_ = auVar85._0_8_;
        auVar117._0_8_ = auVar85._0_8_;
        auVar116 = vshufpd_avx(auVar85,auVar85,1);
        auVar145 = vmovshdup_avx(auVar6);
        auVar116 = vsubps_avx(auVar116,auVar117);
        auVar86._0_4_ = auVar145._0_4_ * auVar116._0_4_ + fVar218;
        auVar86._4_4_ = auVar145._4_4_ * auVar116._4_4_ + fVar211;
        auVar86._8_4_ = auVar145._8_4_ * auVar116._8_4_ + fVar218;
        auVar86._12_4_ = auVar145._12_4_ * auVar116._12_4_ + fVar211;
        auVar145 = vshufps_avx(auVar86,auVar86,0);
        auVar116 = vshufps_avx(auVar86,auVar86,0x55);
        auVar118._0_4_ = auVar147._0_4_ * auVar145._0_4_ + auVar197._0_4_ * auVar116._0_4_;
        auVar118._4_4_ = auVar147._4_4_ * auVar145._4_4_ + auVar197._4_4_ * auVar116._4_4_;
        auVar118._8_4_ = auVar147._8_4_ * auVar145._8_4_ + auVar197._8_4_ * auVar116._8_4_;
        auVar118._12_4_ = auVar147._12_4_ * auVar145._12_4_ + auVar197._12_4_ * auVar116._12_4_;
        auVar6 = vsubps_avx(auVar6,auVar118);
        auVar145 = vandps_avx(auVar258,auVar86);
        auVar116 = vshufps_avx(auVar145,auVar145,0xf5);
        auVar145 = vmaxss_avx(auVar116,auVar145);
        if (auVar145._0_4_ < (float)local_4d0._0_4_) {
          fVar218 = auVar6._0_4_;
          if ((0.0 <= fVar218) && (fVar218 <= 1.0)) {
            auVar147 = vmovshdup_avx(auVar6);
            fVar211 = auVar147._0_4_;
            if ((0.0 <= fVar211) && (fVar211 <= 1.0)) {
              auVar147 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                       ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar235 = vinsertps_avx(auVar147,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                       0x28);
              auVar147 = vdpps_avx(auVar235,local_3a0,0x7f);
              auVar197 = vdpps_avx(auVar235,local_3b0,0x7f);
              auVar145 = vdpps_avx(auVar235,local_3e0,0x7f);
              auVar116 = vdpps_avx(auVar235,local_3f0,0x7f);
              auVar105 = vdpps_avx(auVar235,local_400,0x7f);
              auVar135 = vdpps_avx(auVar235,local_410,0x7f);
              fVar233 = 1.0 - fVar211;
              auVar106 = vdpps_avx(auVar235,local_3c0,0x7f);
              auVar235 = vdpps_avx(auVar235,local_3d0,0x7f);
              fVar214 = 1.0 - fVar218;
              fVar231 = auVar6._4_4_;
              fVar212 = auVar6._8_4_;
              fVar232 = auVar6._12_4_;
              fVar213 = fVar214 * fVar218 * fVar218 * 3.0;
              auVar206._0_4_ = fVar218 * fVar218 * fVar218;
              auVar206._4_4_ = fVar231 * fVar231 * fVar231;
              auVar206._8_4_ = fVar212 * fVar212 * fVar212;
              auVar206._12_4_ = fVar232 * fVar232 * fVar232;
              fVar231 = fVar218 * 3.0 * fVar214 * fVar214;
              fVar212 = fVar214 * fVar214 * fVar214;
              fVar218 = (fVar233 * auVar147._0_4_ + fVar211 * auVar145._0_4_) * fVar212 +
                        (fVar233 * auVar197._0_4_ + fVar211 * auVar116._0_4_) * fVar231 +
                        fVar213 * (fVar233 * auVar106._0_4_ + fVar211 * auVar105._0_4_) +
                        auVar206._0_4_ * (auVar135._0_4_ * fVar211 + fVar233 * auVar235._0_4_);
              if ((fVar191 <= fVar218) &&
                 (fVar211 = *(float *)(ray + k * 4 + 0x100), fVar218 <= fVar211)) {
                pGVar8 = (context->scene->geometries).items[uVar62].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_0109d471:
                  bVar63 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar63 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_f0 = vshufps_avx(auVar6,auVar6,0x55);
                  auVar259._8_4_ = 0x3f800000;
                  auVar259._0_8_ = 0x3f8000003f800000;
                  auVar259._12_4_ = 0x3f800000;
                  auVar147 = vsubps_avx(auVar259,local_f0);
                  fVar232 = local_f0._0_4_;
                  fVar233 = local_f0._4_4_;
                  fVar234 = local_f0._8_4_;
                  fVar215 = local_f0._12_4_;
                  fVar236 = auVar147._0_4_;
                  fVar186 = auVar147._4_4_;
                  fVar188 = auVar147._8_4_;
                  fVar190 = auVar147._12_4_;
                  auVar278._0_4_ =
                       fVar232 * (float)local_4f0._0_4_ + fVar236 * (float)local_4e0._0_4_;
                  auVar278._4_4_ =
                       fVar233 * (float)local_4f0._4_4_ + fVar186 * (float)local_4e0._4_4_;
                  auVar278._8_4_ = fVar234 * fStack_4e8 + fVar188 * fStack_4d8;
                  auVar278._12_4_ = fVar215 * fStack_4e4 + fVar190 * fStack_4d4;
                  auVar292._0_4_ =
                       fVar232 * (float)local_540._0_4_ + fVar236 * (float)local_520._0_4_;
                  auVar292._4_4_ =
                       fVar233 * (float)local_540._4_4_ + fVar186 * (float)local_520._4_4_;
                  auVar292._8_4_ = fVar234 * fStack_538 + fVar188 * fStack_518;
                  auVar292._12_4_ = fVar215 * fStack_534 + fVar190 * fStack_514;
                  auVar302._0_4_ =
                       fVar232 * (float)local_430._0_4_ + fVar236 * (float)local_530._0_4_;
                  auVar302._4_4_ =
                       fVar233 * (float)local_430._4_4_ + fVar186 * (float)local_530._4_4_;
                  auVar302._8_4_ = fVar234 * fStack_428 + fVar188 * fStack_528;
                  auVar302._12_4_ = fVar215 * fStack_424 + fVar190 * fStack_524;
                  auVar260._0_4_ =
                       fVar232 * (float)local_510._0_4_ + fVar236 * (float)local_500._0_4_;
                  auVar260._4_4_ =
                       fVar233 * (float)local_510._4_4_ + fVar186 * (float)local_500._4_4_;
                  auVar260._8_4_ = fVar234 * fStack_508 + fVar188 * fStack_4f8;
                  auVar260._12_4_ = fVar215 * fStack_504 + fVar190 * fStack_4f4;
                  auVar116 = vsubps_avx(auVar292,auVar278);
                  auVar105 = vsubps_avx(auVar302,auVar292);
                  auVar135 = vsubps_avx(auVar260,auVar302);
                  local_110 = vshufps_avx(auVar6,auVar6,0);
                  fVar232 = local_110._0_4_;
                  fVar234 = local_110._4_4_;
                  fVar215 = local_110._8_4_;
                  fVar186 = local_110._12_4_;
                  auVar147 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
                  fVar233 = auVar147._0_4_;
                  fVar214 = auVar147._4_4_;
                  fVar236 = auVar147._8_4_;
                  fVar188 = auVar147._12_4_;
                  auVar147 = vshufps_avx(auVar206,auVar206,0);
                  auVar197 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
                  auVar145 = vshufps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar231),0);
                  auVar181._0_4_ =
                       ((auVar105._0_4_ * fVar233 + auVar135._0_4_ * fVar232) * fVar232 +
                       (auVar116._0_4_ * fVar233 + auVar105._0_4_ * fVar232) * fVar233) * 3.0;
                  auVar181._4_4_ =
                       ((auVar105._4_4_ * fVar214 + auVar135._4_4_ * fVar234) * fVar234 +
                       (auVar116._4_4_ * fVar214 + auVar105._4_4_ * fVar234) * fVar214) * 3.0;
                  auVar181._8_4_ =
                       ((auVar105._8_4_ * fVar236 + auVar135._8_4_ * fVar215) * fVar215 +
                       (auVar116._8_4_ * fVar236 + auVar105._8_4_ * fVar215) * fVar236) * 3.0;
                  auVar181._12_4_ =
                       ((auVar105._12_4_ * fVar188 + auVar135._12_4_ * fVar186) * fVar186 +
                       (auVar116._12_4_ * fVar188 + auVar105._12_4_ * fVar186) * fVar188) * 3.0;
                  auVar116 = vshufps_avx(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),0);
                  auVar119._0_4_ =
                       auVar116._0_4_ * (float)local_440._0_4_ +
                       auVar145._0_4_ * (float)local_450._0_4_ +
                       auVar147._0_4_ * (float)local_470._0_4_ +
                       auVar197._0_4_ * (float)local_460._0_4_;
                  auVar119._4_4_ =
                       auVar116._4_4_ * (float)local_440._4_4_ +
                       auVar145._4_4_ * (float)local_450._4_4_ +
                       auVar147._4_4_ * (float)local_470._4_4_ +
                       auVar197._4_4_ * (float)local_460._4_4_;
                  auVar119._8_4_ =
                       auVar116._8_4_ * fStack_438 +
                       auVar145._8_4_ * fStack_448 +
                       auVar147._8_4_ * fStack_468 + auVar197._8_4_ * fStack_458;
                  auVar119._12_4_ =
                       auVar116._12_4_ * fStack_434 +
                       auVar145._12_4_ * fStack_444 +
                       auVar147._12_4_ * fStack_464 + auVar197._12_4_ * fStack_454;
                  auVar147 = vshufps_avx(auVar181,auVar181,0xc9);
                  auVar146._0_4_ = auVar119._0_4_ * auVar147._0_4_;
                  auVar146._4_4_ = auVar119._4_4_ * auVar147._4_4_;
                  auVar146._8_4_ = auVar119._8_4_ * auVar147._8_4_;
                  auVar146._12_4_ = auVar119._12_4_ * auVar147._12_4_;
                  auVar147 = vshufps_avx(auVar119,auVar119,0xc9);
                  auVar120._0_4_ = auVar181._0_4_ * auVar147._0_4_;
                  auVar120._4_4_ = auVar181._4_4_ * auVar147._4_4_;
                  auVar120._8_4_ = auVar181._8_4_ * auVar147._8_4_;
                  auVar120._12_4_ = auVar181._12_4_ * auVar147._12_4_;
                  auVar147 = vsubps_avx(auVar120,auVar146);
                  local_170 = vshufps_avx(auVar147,auVar147,0x55);
                  local_180[0] = (RTCHitN)local_170[0];
                  local_180[1] = (RTCHitN)local_170[1];
                  local_180[2] = (RTCHitN)local_170[2];
                  local_180[3] = (RTCHitN)local_170[3];
                  local_180[4] = (RTCHitN)local_170[4];
                  local_180[5] = (RTCHitN)local_170[5];
                  local_180[6] = (RTCHitN)local_170[6];
                  local_180[7] = (RTCHitN)local_170[7];
                  local_180[8] = (RTCHitN)local_170[8];
                  local_180[9] = (RTCHitN)local_170[9];
                  local_180[10] = (RTCHitN)local_170[10];
                  local_180[0xb] = (RTCHitN)local_170[0xb];
                  local_180[0xc] = (RTCHitN)local_170[0xc];
                  local_180[0xd] = (RTCHitN)local_170[0xd];
                  local_180[0xe] = (RTCHitN)local_170[0xe];
                  local_180[0xf] = (RTCHitN)local_170[0xf];
                  local_150 = vshufps_avx(auVar147,auVar147,0xaa);
                  local_160 = local_150;
                  local_130 = vshufps_avx(auVar147,auVar147,0);
                  local_140 = local_130;
                  local_120 = local_110;
                  local_100 = local_f0;
                  local_e0 = local_320._0_8_;
                  uStack_d8 = local_320._8_8_;
                  uStack_d0 = local_320._16_8_;
                  uStack_c8 = local_320._24_8_;
                  local_c0 = local_300._0_8_;
                  uStack_b8 = local_300._8_8_;
                  uStack_b0 = local_300._16_8_;
                  uStack_a8 = local_300._24_8_;
                  auVar87 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar218;
                  local_580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar66 & 0xf) << 4));
                  local_570 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)((int)uVar66 >> 4) * 0x10);
                  local_4a0.valid = (int *)local_580;
                  local_4a0.geometryUserPtr = pGVar8->userPtr;
                  local_4a0.context = context->user;
                  local_4a0.ray = (RTCRayN *)ray;
                  local_4a0.hit = local_180;
                  local_4a0.N = 8;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_4a0);
                  }
                  auVar147 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
                  auVar197 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
                  auVar153._16_16_ = auVar197;
                  auVar153._0_16_ = auVar147;
                  auVar14 = auVar87 & ~auVar153;
                  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar14 >> 0x7f,0) != '\0') ||
                        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar14 >> 0xbf,0) != '\0') ||
                      (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar14[0x1f] < '\0') {
                    p_Var9 = context->args->filter;
                    if (p_Var9 == (RTCFilterFunctionN)0x0) {
                      auVar147 = SUB6416(ZEXT864(0),0) << 0x20;
                    }
                    else {
                      auVar147 = SUB6416(ZEXT864(0),0) << 0x20;
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var9)(&local_4a0);
                        auVar147 = ZEXT816(0) << 0x40;
                      }
                    }
                    auVar197 = vpcmpeqd_avx(local_580,auVar147);
                    auVar147 = vpcmpeqd_avx(local_570,auVar147);
                    auVar96._16_16_ = auVar147;
                    auVar96._0_16_ = auVar197;
                    auVar129._8_4_ = 0xff800000;
                    auVar129._0_8_ = 0xff800000ff800000;
                    auVar129._12_4_ = 0xff800000;
                    auVar129._16_4_ = 0xff800000;
                    auVar129._20_4_ = 0xff800000;
                    auVar129._24_4_ = 0xff800000;
                    auVar129._28_4_ = 0xff800000;
                    auVar14 = vblendvps_avx(auVar129,*(undefined1 (*) [32])(local_4a0.ray + 0x100),
                                            auVar96);
                    *(undefined1 (*) [32])(local_4a0.ray + 0x100) = auVar14;
                    auVar87 = auVar87 & ~auVar96;
                    if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar87 >> 0x7f,0) != '\0') ||
                          (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar87 >> 0xbf,0) != '\0') ||
                        (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar87[0x1f] < '\0') {
                      bVar63 = 1;
                      goto LAB_0109d473;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar211;
                  goto LAB_0109d471;
                }
LAB_0109d473:
                bVar71 = (bool)(bVar71 | bVar63);
              }
            }
          }
          break;
        }
        lVar68 = lVar68 + -1;
      } while (lVar68 != 0);
      goto LAB_0109c38f;
    }
    auVar147 = vinsertps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar218),0x10);
    auVar322 = ZEXT1664(auVar147);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }